

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  __m512 x;
  __m512 x_00;
  __m512 x_01;
  __m512 y;
  __m512 y_00;
  __m512 y_01;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  int in_ECX;
  undefined1 (*in_RDX) [64];
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar138;
  undefined8 uVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined8 uVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined8 uVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined8 uVar154;
  undefined8 uVar155;
  undefined8 uVar156;
  undefined8 uVar157;
  undefined8 uVar158;
  __m128 _outp_5;
  __m128 _b_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_512_1;
  __m256 _p_256;
  __m128 _p_2;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_512;
  __m256 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 special_result_1;
  __m256 negative_mask_full_x_1;
  __m256 normal_result_1;
  __m256 pi_additions_1;
  __m256 negative_mask_y_1;
  __m256 negative_mask_x_1;
  __m256 normal_mode_1;
  __m256 not_equal_zero_y_1;
  __m256 not_equal_zero_x_1;
  __m256 magic_half_pi_2;
  __m256 magic_pi_1;
  __m256 magic_negative_zero_2;
  __m256 magic_zero_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_3;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_3;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_2;
  __m128 negative_mask_full_x_2;
  __m128 normal_result_2;
  __m128 pi_additions_2;
  __m128 negative_mask_y_2;
  __m128 negative_mask_x_2;
  __m128 normal_mode_2;
  __m128 not_equal_zero_y_2;
  __m128 not_equal_zero_x_2;
  __m128 magic_half_pi_4;
  __m128 magic_pi_2;
  __m128 magic_negative_zero_4;
  __m128 magic_zero_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_5;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_5;
  undefined8 local_4300;
  undefined8 uStackY_42f8;
  undefined8 local_42e0;
  undefined8 uStackY_42d8;
  undefined8 uStackY_42d0;
  undefined8 uStackY_42c8;
  undefined1 local_4240 [64];
  undefined8 local_4200;
  undefined8 uStackY_41f8;
  undefined8 uStackY_41f0;
  undefined8 uStackY_41e8;
  undefined8 local_41e0;
  undefined8 uStackY_41d8;
  undefined8 uStackY_41d0;
  undefined8 uStackY_41c8;
  undefined8 local_41c0;
  undefined8 uStackY_41b8;
  undefined8 local_41b0;
  undefined8 uStackY_41a8;
  undefined8 local_41a0;
  undefined8 uStackY_4198;
  undefined8 local_4190;
  undefined8 uStackY_4188;
  undefined1 local_4180 [64];
  undefined8 local_4140;
  undefined8 uStackY_4138;
  undefined8 uStackY_4130;
  undefined8 uStackY_4128;
  undefined8 local_4120;
  undefined8 uStackY_4118;
  undefined4 in_stack_ffffffffffffbef8;
  undefined4 in_stack_ffffffffffffbefc;
  int iVar159;
  undefined8 in_stack_ffffffffffffbf00;
  undefined8 in_stack_ffffffffffffbf08;
  undefined8 in_stack_ffffffffffffbf10;
  undefined8 in_stack_ffffffffffffbf18;
  undefined8 in_stack_ffffffffffffbf20;
  undefined8 in_stack_ffffffffffffbf28;
  undefined8 in_stack_ffffffffffffbf30;
  undefined8 in_stack_ffffffffffffbf38;
  undefined8 in_stack_ffffffffffffbf40;
  undefined8 in_stack_ffffffffffffbf48;
  undefined8 in_stack_ffffffffffffbf50;
  undefined8 in_stack_ffffffffffffbf58;
  undefined8 in_stack_ffffffffffffbf60;
  undefined8 in_stack_ffffffffffffbf68;
  undefined8 in_stack_ffffffffffffbf70;
  undefined1 local_4080 [64];
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined1 local_4000 [64];
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  int local_3f84;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 uStack_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 uStack_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 uStack_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  int local_3eb0;
  undefined1 local_3ea9;
  int local_3ea8;
  int local_3ea4;
  undefined1 (*local_3ea0) [64];
  uint *local_3e98;
  undefined1 (*local_3e90) [32];
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 uStack_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined1 (*local_3e08) [64];
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 uStack_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined1 (*local_3d88) [64];
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 uStack_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined1 (*local_3d10) [64];
  undefined1 (*local_3d08) [32];
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined1 (*local_3c90) [64];
  undefined1 (*local_3c88) [32];
  uint local_3c00;
  uint uStack_3bfc;
  uint uStack_3bf8;
  uint uStack_3bf4;
  uint local_3be4;
  uint local_3be0;
  uint uStack_3bdc;
  uint uStack_3bd8;
  uint uStack_3bd4;
  uint local_3bc4;
  uint local_3bc0;
  uint uStack_3bbc;
  uint uStack_3bb8;
  uint uStack_3bb4;
  uint local_3ba4;
  uint local_3ba0;
  uint uStack_3b9c;
  uint uStack_3b98;
  uint uStack_3b94;
  uint local_3b84;
  undefined8 local_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 local_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined1 local_3ac0 [64];
  uint local_3a70;
  uint local_3a6c;
  uint local_3a68;
  uint local_3a64;
  undefined1 local_3a60 [16];
  undefined1 auStack_3a50 [16];
  uint local_3a40;
  uint local_3a3c;
  uint local_3a38;
  uint local_3a34;
  uint local_3a30;
  uint local_3a2c;
  uint local_3a28;
  uint local_3a24;
  undefined1 local_3a20 [16];
  undefined1 auStack_3a10 [16];
  uint local_3a00;
  uint local_39fc;
  uint local_39f8;
  uint local_39f4;
  uint local_39f0;
  uint local_39ec;
  uint local_39e8;
  uint local_39e4;
  undefined1 local_39e0 [16];
  undefined1 auStack_39d0 [16];
  uint local_39b0;
  uint local_39ac;
  uint local_39a8;
  uint local_39a4;
  uint local_39a0;
  uint local_399c;
  uint local_3998;
  uint local_3994;
  undefined1 *local_3990;
  undefined1 *local_3988;
  undefined1 *local_3980;
  undefined1 *local_3978;
  undefined1 *local_3970;
  undefined1 *local_3968;
  undefined8 *local_3960;
  undefined8 *local_3958;
  undefined1 *local_3950;
  undefined1 *local_3930;
  undefined8 *local_3928;
  undefined1 *local_3920;
  undefined1 local_3900 [32];
  undefined1 local_38e0 [32];
  float local_38c0;
  float fStack_38bc;
  float fStack_38b8;
  float fStack_38b4;
  float fStack_38b0;
  float fStack_38ac;
  float fStack_38a8;
  float fStack_38a4;
  undefined1 local_38a0 [32];
  undefined1 local_3880 [32];
  undefined1 local_3860 [32];
  undefined1 local_3840 [32];
  undefined1 local_3820 [32];
  undefined1 local_3800 [32];
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined1 local_3700 [8];
  float fStack_36f8;
  float fStack_36f4;
  float fStack_36f0;
  float fStack_36ec;
  float fStack_36e8;
  float fStack_36e4;
  undefined4 local_36d0;
  undefined4 local_36cc;
  undefined4 local_36c8;
  undefined4 local_36c4;
  undefined1 local_36c0 [16];
  undefined1 auStack_36b0 [16];
  undefined4 local_36a0;
  undefined4 local_369c;
  undefined4 local_3698;
  undefined4 local_3694;
  undefined4 local_3690;
  undefined4 local_368c;
  undefined4 local_3688;
  undefined4 local_3684;
  undefined1 local_3680 [16];
  undefined1 auStack_3670 [16];
  undefined4 local_3660;
  undefined4 local_365c;
  undefined4 local_3658;
  undefined4 local_3654;
  undefined4 local_3650;
  undefined4 local_364c;
  undefined4 local_3648;
  undefined4 local_3644;
  undefined1 local_3640 [16];
  undefined1 auStack_3630 [16];
  undefined4 local_3620;
  undefined4 local_361c;
  undefined4 local_3618;
  undefined4 local_3614;
  undefined4 local_3610;
  undefined4 local_360c;
  undefined4 local_3608;
  undefined4 local_3604;
  undefined1 local_3600 [16];
  undefined1 auStack_35f0 [16];
  undefined4 local_35e0;
  undefined4 local_35dc;
  undefined4 local_35d8;
  undefined4 local_35d4;
  undefined4 local_35d0;
  undefined4 local_35cc;
  undefined4 local_35c8;
  undefined4 local_35c4;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined1 local_3500 [32];
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined1 local_34c0 [32];
  undefined1 local_34a0 [32];
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined1 local_3460 [32];
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined1 local_3380 [32];
  undefined1 local_3360 [32];
  undefined1 local_3340 [32];
  undefined1 local_3320 [32];
  undefined1 local_3300 [32];
  undefined1 local_32e0 [32];
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined1 local_3220 [32];
  float local_3020;
  float fStack_301c;
  float fStack_3018;
  float fStack_3014;
  float fStack_3010;
  float fStack_300c;
  float fStack_3008;
  float fStack_3004;
  float local_3000;
  float fStack_2ffc;
  float fStack_2ff8;
  float fStack_2ff4;
  float fStack_2ff0;
  float fStack_2fec;
  float fStack_2fe8;
  float fStack_2fe4;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  float local_2780;
  float fStack_277c;
  float fStack_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  float local_23a0;
  float fStack_239c;
  float fStack_2398;
  float fStack_2394;
  float local_2320;
  float fStack_231c;
  float fStack_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  float fStack_2308;
  float fStack_2304;
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [32];
  undefined1 local_1c60 [32];
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  float fStack_1c24;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [8];
  float fStack_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float fStack_19a8;
  float fStack_19a4;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined4 local_196c;
  undefined4 local_1968;
  undefined4 local_1964;
  undefined4 local_1960;
  undefined4 local_195c;
  undefined4 local_1958;
  undefined4 local_1954;
  undefined4 local_1950;
  undefined4 local_194c;
  undefined4 local_1948;
  undefined4 local_1944;
  undefined1 local_1940 [16];
  undefined1 auStack_1930 [16];
  undefined4 local_1920;
  undefined4 local_191c;
  undefined4 local_1918;
  undefined4 local_1914;
  undefined4 local_1910;
  undefined4 local_190c;
  undefined4 local_1908;
  undefined4 local_1904;
  undefined1 local_1900 [16];
  undefined1 auStack_18f0 [16];
  undefined4 local_18e0;
  undefined4 local_18dc;
  undefined4 local_18d8;
  undefined4 local_18d4;
  undefined4 local_18d0;
  undefined4 local_18cc;
  undefined4 local_18c8;
  undefined4 local_18c4;
  undefined1 local_18c0 [16];
  undefined1 auStack_18b0 [16];
  undefined4 local_18a0;
  undefined4 local_189c;
  undefined4 local_1898;
  undefined4 local_1894;
  undefined4 local_1890;
  undefined4 local_188c;
  undefined4 local_1888;
  undefined4 local_1884;
  undefined1 local_1880 [16];
  undefined1 auStack_1870 [16];
  undefined4 local_1860;
  undefined4 local_185c;
  undefined4 local_1858;
  undefined4 local_1854;
  undefined4 local_1850;
  undefined4 local_184c;
  undefined4 local_1848;
  undefined4 local_1844;
  undefined1 local_1840 [16];
  undefined1 auStack_1830 [16];
  undefined4 local_1820;
  undefined4 local_181c;
  undefined4 local_1818;
  undefined4 local_1814;
  undefined4 local_1810;
  undefined4 local_180c;
  undefined4 local_1808;
  undefined4 local_1804;
  undefined1 local_1800 [16];
  undefined1 auStack_17f0 [16];
  undefined4 local_17e0;
  undefined4 local_17dc;
  undefined4 local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined4 local_17c4;
  undefined1 local_17c0 [16];
  undefined1 auStack_17b0 [16];
  undefined4 local_17a0;
  undefined4 local_179c;
  undefined4 local_1798;
  undefined4 local_1794;
  undefined4 local_1790;
  undefined4 local_178c;
  undefined4 local_1788;
  undefined4 local_1784;
  undefined1 local_1780 [16];
  undefined1 auStack_1770 [16];
  undefined4 local_1760;
  undefined4 local_175c;
  undefined4 local_1758;
  undefined4 local_1754;
  undefined4 local_1750;
  undefined4 local_174c;
  undefined4 local_1748;
  undefined4 local_1744;
  undefined1 local_1740 [16];
  undefined1 auStack_1730 [16];
  undefined4 local_1720;
  undefined4 local_171c;
  undefined4 local_1718;
  undefined4 local_1714;
  undefined4 local_1710;
  undefined4 local_170c;
  undefined4 local_1708;
  undefined4 local_1704;
  undefined1 local_1700 [16];
  undefined1 auStack_16f0 [16];
  undefined4 local_16e0;
  undefined4 local_16dc;
  undefined4 local_16d8;
  undefined4 local_16d4;
  undefined4 local_16d0;
  undefined4 local_16cc;
  undefined4 local_16c8;
  undefined4 local_16c4;
  undefined1 local_16c0 [16];
  undefined1 auStack_16b0 [16];
  undefined4 local_16a0;
  undefined4 local_169c;
  undefined4 local_1698;
  undefined4 local_1694;
  undefined4 local_1690;
  undefined4 local_168c;
  undefined4 local_1688;
  undefined4 local_1684;
  undefined1 local_1680 [16];
  undefined1 auStack_1670 [16];
  undefined4 local_1660;
  undefined4 local_165c;
  undefined4 local_1658;
  undefined4 local_1654;
  undefined4 local_1650;
  undefined4 local_164c;
  undefined4 local_1648;
  undefined4 local_1644;
  undefined1 local_1640 [16];
  undefined1 auStack_1630 [16];
  undefined4 local_1620;
  undefined4 local_161c;
  undefined4 local_1618;
  undefined4 local_1614;
  undefined4 local_1610;
  undefined4 local_160c;
  undefined4 local_1608;
  undefined4 local_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 *local_1500;
  undefined1 *local_14f8;
  float *local_14f0;
  undefined8 *local_14e8;
  undefined1 *local_14e0;
  float *local_14d8;
  undefined8 *local_14d0;
  undefined1 *local_14c8;
  float *local_14c0;
  undefined8 *local_14b8;
  undefined1 *local_14b0;
  float *local_14a8;
  undefined8 *local_14a0;
  undefined8 *local_1498;
  float *local_1490;
  undefined8 *local_1488;
  undefined1 *local_1480;
  float *local_1478;
  undefined8 *local_1470;
  undefined1 *local_1468;
  float *local_1460;
  undefined8 *local_1458;
  undefined8 *local_1450;
  float *local_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [32];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  
  local_3ea8 = in_R8D;
  local_3ea4 = in_ECX;
  local_3ea0 = in_RDX;
  local_3e98 = in_RSI;
  local_3e90 = in_RDI;
  if (in_R8D == 0x10) {
    local_3eb0 = 0;
    local_3f00 = *(undefined8 *)*in_RDI;
    uStack_3ef8 = *(undefined8 *)(*in_RDI + 8);
    uStack_3ef0 = *(undefined8 *)(*in_RDI + 0x10);
    uStack_3ee8 = *(undefined8 *)(*in_RDI + 0x18);
    uStack_3ee0 = *(undefined8 *)in_RDI[1];
    uStack_3ed8 = *(undefined8 *)(in_RDI[1] + 8);
    uStack_3ed0 = *(undefined8 *)(in_RDI[1] + 0x10);
    uStack_3ec8 = *(undefined8 *)(in_RDI[1] + 0x18);
    for (; local_3eb0 < local_3ea4; local_3eb0 = local_3eb0 + 1) {
      local_3a70 = *local_3e98;
      local_3ac0 = vbroadcastss_avx512f(ZEXT416(local_3a70));
      local_3f40 = local_3ac0._0_8_;
      uStack_3f38 = local_3ac0._8_8_;
      uStack_3f30 = local_3ac0._16_8_;
      uStack_3f28 = local_3ac0._24_8_;
      uStack_3f20 = local_3ac0._32_8_;
      uStack_3f18 = local_3ac0._40_8_;
      uStack_3f10 = local_3ac0._48_8_;
      uStack_3f08 = local_3ac0._56_8_;
      local_3950 = &local_3ea9;
      local_3958 = &local_3f00;
      local_3960 = &local_3f40;
      y[2] = (float)(int)in_stack_ffffffffffffbf40;
      y[3] = (float)(int)((ulong)in_stack_ffffffffffffbf40 >> 0x20);
      y[0] = (float)(int)in_stack_ffffffffffffbf38;
      y[1] = (float)(int)((ulong)in_stack_ffffffffffffbf38 >> 0x20);
      y[4] = (float)(int)in_stack_ffffffffffffbf48;
      y[5] = (float)(int)((ulong)in_stack_ffffffffffffbf48 >> 0x20);
      y[6] = (float)(int)in_stack_ffffffffffffbf50;
      y[7] = (float)(int)((ulong)in_stack_ffffffffffffbf50 >> 0x20);
      y[8] = (float)(int)in_stack_ffffffffffffbf58;
      y[9] = (float)(int)((ulong)in_stack_ffffffffffffbf58 >> 0x20);
      y[10] = (float)(int)in_stack_ffffffffffffbf60;
      y[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      y[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      y[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      y[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      y[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      x[1] = (float)in_stack_ffffffffffffbefc;
      x[0] = (float)in_stack_ffffffffffffbef8;
      x[2] = (float)(int)in_stack_ffffffffffffbf00;
      x[3] = (float)(int)((ulong)in_stack_ffffffffffffbf00 >> 0x20);
      x[4] = (float)(int)in_stack_ffffffffffffbf08;
      x[5] = (float)(int)((ulong)in_stack_ffffffffffffbf08 >> 0x20);
      x[6] = (float)(int)in_stack_ffffffffffffbf10;
      x[7] = (float)(int)((ulong)in_stack_ffffffffffffbf10 >> 0x20);
      x[8] = (float)(int)in_stack_ffffffffffffbf18;
      x[9] = (float)(int)((ulong)in_stack_ffffffffffffbf18 >> 0x20);
      x[10] = (float)(int)in_stack_ffffffffffffbf20;
      x[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf20 >> 0x20);
      x[0xc] = (float)(int)in_stack_ffffffffffffbf28;
      x[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf28 >> 0x20);
      x[0xe] = (float)(int)in_stack_ffffffffffffbf30;
      x[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf30 >> 0x20);
      uVar139 = local_3f00;
      uVar144 = uStack_3ef8;
      uVar149 = uStack_3ef0;
      uVar154 = uStack_3ee8;
      uVar155 = uStack_3ee0;
      uVar156 = uStack_3ed8;
      uVar157 = uStack_3ed0;
      uVar158 = uStack_3ec8;
      atan2512_ps(y,x);
      local_3d10 = local_3ea0;
      *(undefined8 *)*local_3ea0 = uVar139;
      *(undefined8 *)(*local_3ea0 + 8) = uVar144;
      *(undefined8 *)(*local_3ea0 + 0x10) = uVar149;
      *(undefined8 *)(*local_3ea0 + 0x18) = uVar154;
      *(undefined8 *)(*local_3ea0 + 0x20) = uVar155;
      *(undefined8 *)(*local_3ea0 + 0x28) = uVar156;
      *(undefined8 *)(*local_3ea0 + 0x30) = uVar157;
      *(undefined8 *)(*local_3ea0 + 0x38) = uVar158;
      local_3e98 = local_3e98 + 1;
      local_3ea0 = local_3ea0 + 1;
      local_3f80 = uVar139;
      uStack_3f78 = uVar144;
      uStack_3f70 = uVar149;
      uStack_3f68 = uVar154;
      uStack_3f60 = uVar155;
      uStack_3f58 = uVar156;
      uStack_3f50 = uVar157;
      uStack_3f48 = uVar158;
      local_3d80 = uVar139;
      uStack_3d78 = uVar144;
      uStack_3d70 = uVar149;
      uStack_3d68 = uVar154;
      uStack_3d60 = uVar155;
      uStack_3d58 = uVar156;
      uStack_3d50 = uVar157;
      uStack_3d48 = uVar158;
    }
  }
  if (local_3ea8 == 8) {
    local_3f84 = 0;
    local_3d08 = local_3e90;
    local_3fc0 = *(undefined8 *)*local_3e90;
    uStack_3fb8 = *(undefined8 *)(*local_3e90 + 8);
    uStack_3fb0 = *(undefined8 *)(*local_3e90 + 0x10);
    uStack_3fa8 = *(undefined8 *)(*local_3e90 + 0x18);
    local_4000 = vinsertf64x4_avx512f(ZEXT3264(*local_3e90),*local_3e90,1);
    local_3ae0 = local_3fc0;
    uStack_3ad8 = uStack_3fb8;
    uStack_3ad0 = uStack_3fb0;
    uStack_3ac8 = uStack_3fa8;
    for (; local_3f84 + 1 < local_3ea4; local_3f84 = local_3f84 + 2) {
      local_3a64 = *local_3e98;
      auVar3 = vinsertps_avx(ZEXT416(local_3a64),ZEXT416(local_3a64),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x20);
      local_3a60 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a64),ZEXT416(local_3a64),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x20);
      auStack_3a50 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x30);
      local_4020 = local_3a60._0_8_;
      uStack_4018 = local_3a60._8_8_;
      uStack_4010 = auStack_3a50._0_8_;
      uStack_4008 = auStack_3a50._8_8_;
      local_3a68 = local_3e98[1];
      auVar3 = vinsertps_avx(ZEXT416(local_3a68),ZEXT416(local_3a68),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x20);
      local_3a20 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a68),ZEXT416(local_3a68),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x20);
      auStack_3a10 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x30);
      local_4040 = local_3a20._0_8_;
      uStack_4038 = local_3a20._8_8_;
      uStack_4030 = auStack_3a10._0_8_;
      uStack_4028 = auStack_3a10._8_8_;
      local_3b00 = local_3a60._0_8_;
      uStack_3af8 = local_3a60._8_8_;
      uStack_3af0 = auStack_3a50._0_8_;
      uStack_3ae8 = auStack_3a50._8_8_;
      auVar135._16_8_ = auStack_3a10._0_8_;
      auVar135._0_16_ = local_3a20;
      auVar135._24_8_ = auStack_3a10._8_8_;
      local_4080 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT824(auStack_3a50._8_8_,
                                                 CONCAT816(auStack_3a50._0_8_,local_3a60))),auVar135
                              ,1);
      local_3968 = &local_3ea9;
      local_3970 = local_4000;
      local_3978 = local_4080;
      y_00[2] = (float)(int)in_stack_ffffffffffffbf40;
      y_00[3] = (float)(int)((ulong)in_stack_ffffffffffffbf40 >> 0x20);
      y_00[0] = (float)(int)in_stack_ffffffffffffbf38;
      y_00[1] = (float)(int)((ulong)in_stack_ffffffffffffbf38 >> 0x20);
      y_00[4] = (float)(int)in_stack_ffffffffffffbf48;
      y_00[5] = (float)(int)((ulong)in_stack_ffffffffffffbf48 >> 0x20);
      y_00[6] = (float)(int)in_stack_ffffffffffffbf50;
      y_00[7] = (float)(int)((ulong)in_stack_ffffffffffffbf50 >> 0x20);
      y_00[8] = (float)(int)in_stack_ffffffffffffbf58;
      y_00[9] = (float)(int)((ulong)in_stack_ffffffffffffbf58 >> 0x20);
      y_00[10] = (float)(int)in_stack_ffffffffffffbf60;
      y_00[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      y_00[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      y_00[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      y_00[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      y_00[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      x_00[1] = (float)in_stack_ffffffffffffbefc;
      x_00[0] = (float)in_stack_ffffffffffffbef8;
      x_00[2] = (float)(int)in_stack_ffffffffffffbf00;
      x_00[3] = (float)(int)((ulong)in_stack_ffffffffffffbf00 >> 0x20);
      x_00[4] = (float)(int)in_stack_ffffffffffffbf08;
      x_00[5] = (float)(int)((ulong)in_stack_ffffffffffffbf08 >> 0x20);
      x_00[6] = (float)(int)in_stack_ffffffffffffbf10;
      x_00[7] = (float)(int)((ulong)in_stack_ffffffffffffbf10 >> 0x20);
      x_00[8] = (float)(int)in_stack_ffffffffffffbf18;
      x_00[9] = (float)(int)((ulong)in_stack_ffffffffffffbf18 >> 0x20);
      x_00[10] = (float)(int)in_stack_ffffffffffffbf20;
      x_00[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf20 >> 0x20);
      x_00[0xc] = (float)(int)in_stack_ffffffffffffbf28;
      x_00[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf28 >> 0x20);
      x_00[0xe] = (float)(int)in_stack_ffffffffffffbf30;
      x_00[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf30 >> 0x20);
      in_stack_ffffffffffffbf40 = local_4000._0_8_;
      in_stack_ffffffffffffbf48 = local_4000._8_8_;
      in_stack_ffffffffffffbf50 = local_4000._16_8_;
      in_stack_ffffffffffffbf58 = local_4000._24_8_;
      in_stack_ffffffffffffbf60 = local_4000._32_8_;
      in_stack_ffffffffffffbf68 = local_4000._40_8_;
      in_stack_ffffffffffffbf70 = local_4000._48_8_;
      uVar139 = local_4000._56_8_;
      local_3a40 = local_3a64;
      local_3a3c = local_3a64;
      local_3a38 = local_3a64;
      local_3a34 = local_3a64;
      local_3a30 = local_3a64;
      local_3a2c = local_3a64;
      local_3a28 = local_3a64;
      local_3a24 = local_3a64;
      local_3a00 = local_3a68;
      local_39fc = local_3a68;
      local_39f8 = local_3a68;
      local_39f4 = local_3a68;
      local_39f0 = local_3a68;
      local_39ec = local_3a68;
      local_39e8 = local_3a68;
      local_39e4 = local_3a68;
      atan2512_ps(y_00,x_00);
      local_3d88 = local_3ea0;
      auVar29._8_8_ = in_stack_ffffffffffffbf48;
      auVar29._0_8_ = in_stack_ffffffffffffbf40;
      auVar29._16_8_ = in_stack_ffffffffffffbf50;
      auVar29._24_8_ = in_stack_ffffffffffffbf58;
      auVar29._32_8_ = in_stack_ffffffffffffbf60;
      auVar29._40_8_ = in_stack_ffffffffffffbf68;
      auVar29._48_8_ = in_stack_ffffffffffffbf70;
      auVar29._56_8_ = uVar139;
      *local_3ea0 = auVar29;
      local_3e98 = local_3e98 + 2;
      local_3ea0 = local_3ea0 + 1;
      local_3e00 = in_stack_ffffffffffffbf40;
      uStack_3df8 = in_stack_ffffffffffffbf48;
      uStack_3df0 = in_stack_ffffffffffffbf50;
      uStack_3de8 = in_stack_ffffffffffffbf58;
      uStack_3de0 = in_stack_ffffffffffffbf60;
      uStack_3dd8 = in_stack_ffffffffffffbf68;
      uStack_3dd0 = in_stack_ffffffffffffbf70;
      uStack_3dc8 = uVar139;
    }
    for (; local_3f84 < local_3ea4; local_3f84 = local_3f84 + 1) {
      local_3a6c = *local_3e98;
      auVar3 = vinsertps_avx(ZEXT416(local_3a6c),ZEXT416(local_3a6c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x20);
      local_39e0 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a6c),ZEXT416(local_3a6c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x20);
      auStack_39d0 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x30);
      local_3760 = local_39e0._0_8_;
      uStack_3758 = local_39e0._8_8_;
      uStack_3750 = auStack_39d0._0_8_;
      uStack_3748 = auStack_39d0._8_8_;
      local_3920 = &local_3ea9;
      local_3928 = &local_3fc0;
      local_3930 = &stack0xffffffffffffbf20;
      local_3740 = local_3fc0;
      uStack_3738 = uStack_3fb8;
      uStack_3730 = uStack_3fb0;
      uStack_3728 = uStack_3fa8;
      auVar82._8_8_ = uStack_3fb8;
      auVar82._0_8_ = local_3fc0;
      auVar82._16_8_ = uStack_3fb0;
      auVar82._24_8_ = uStack_3fa8;
      auVar81._8_8_ = uStack_3fb8;
      auVar81._0_8_ = local_3fc0;
      auVar81._16_8_ = uStack_3fb0;
      auVar81._24_8_ = uStack_3fa8;
      auVar80._8_8_ = uStack_3fb8;
      auVar80._0_8_ = local_3fc0;
      auVar80._16_8_ = uStack_3fb0;
      auVar80._24_8_ = uStack_3fa8;
      auVar79._8_8_ = uStack_3fb8;
      auVar79._0_8_ = local_3fc0;
      auVar79._16_8_ = uStack_3fb0;
      auVar79._24_8_ = uStack_3fa8;
      auVar78._16_8_ = auStack_39d0._0_8_;
      auVar78._0_16_ = local_39e0;
      auVar78._24_8_ = auStack_39d0._8_8_;
      auVar77._16_8_ = auStack_39d0._0_8_;
      auVar77._0_16_ = local_39e0;
      auVar77._24_8_ = auStack_39d0._8_8_;
      auVar76._16_8_ = auStack_39d0._0_8_;
      auVar76._0_16_ = local_39e0;
      auVar76._24_8_ = auStack_39d0._8_8_;
      auVar75._16_8_ = auStack_39d0._0_8_;
      auVar75._0_16_ = local_39e0;
      auVar75._24_8_ = auStack_39d0._8_8_;
      local_36c4 = 0;
      local_36a0 = 0;
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      local_36c0 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      auStack_36b0 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      local_3780 = local_36c0._0_8_;
      uStack_3778 = local_36c0._8_8_;
      uStack_3770 = auStack_36b0._0_8_;
      uStack_3768 = auStack_36b0._8_8_;
      local_36c8 = 0x80000000;
      local_3660 = 0x80000000;
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      local_3680 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      auStack_3670 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      local_37a0 = local_3680._0_8_;
      uStack_3798 = local_3680._8_8_;
      uStack_3790 = auStack_3670._0_8_;
      uStack_3788 = auStack_3670._8_8_;
      local_36cc = 0x40490fdb;
      local_3620 = 0x40490fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x20);
      local_3640 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x20);
      auStack_3630 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x30);
      local_37c0 = local_3640._0_8_;
      uStack_37b8 = local_3640._8_8_;
      uStack_37b0 = auStack_3630._0_8_;
      uStack_37a8 = auStack_3630._8_8_;
      local_36d0 = 0x3fc90fdb;
      local_35e0 = 0x3fc90fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      local_3600 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      auStack_35f0 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      local_37e0 = local_3600._0_8_;
      uStack_37d8 = local_3600._8_8_;
      uStack_37d0 = auStack_35f0._0_8_;
      uStack_37c8 = auStack_35f0._8_8_;
      auVar2._16_8_ = auStack_36b0._0_8_;
      auVar2._0_16_ = local_36c0;
      auVar2._24_8_ = auStack_36b0._8_8_;
      local_3800 = vcmpps_avx(auVar75,auVar2,4);
      auVar136._16_8_ = auStack_36b0._0_8_;
      auVar136._0_16_ = local_36c0;
      auVar136._24_8_ = auStack_36b0._8_8_;
      local_3820 = vcmpps_avx(auVar79,auVar136,4);
      local_33a0 = local_3800._0_8_;
      uStack_3398 = local_3800._8_8_;
      uStack_3390 = local_3800._16_8_;
      uStack_3388 = local_3800._24_8_;
      local_33c0 = local_3820._0_8_;
      uStack_33b8 = local_3820._8_8_;
      uStack_33b0 = local_3820._16_8_;
      uStack_33a8 = local_3820._24_8_;
      local_3840 = vpand_avx2(local_3800,local_3820);
      local_33e0 = local_3680._0_8_;
      uStack_33d8 = local_3680._8_8_;
      uStack_33d0 = auStack_3670._0_8_;
      uStack_33c8 = auStack_3670._8_8_;
      auVar19._16_8_ = auStack_3670._0_8_;
      auVar19._0_16_ = local_3680;
      auVar19._24_8_ = auStack_3670._8_8_;
      local_3860 = vpand_avx2(auVar19,auVar76);
      local_3420 = local_3680._0_8_;
      uStack_3418 = local_3680._8_8_;
      uStack_3410 = auStack_3670._0_8_;
      uStack_3408 = auStack_3670._8_8_;
      auVar18._16_8_ = auStack_3670._0_8_;
      auVar18._0_16_ = local_3680;
      auVar18._24_8_ = auStack_3670._8_8_;
      local_3880 = vpand_avx2(auVar18,auVar80);
      auVar13._16_8_ = auStack_36b0._0_8_;
      auVar13._0_16_ = local_36c0;
      auVar13._24_8_ = auStack_36b0._8_8_;
      local_34a0 = vcmpps_avx(auVar77,auVar13,1);
      local_3460 = vcmpps_avx(auVar81,auVar13,1);
      local_3480 = local_3680._0_8_;
      uStack_3478 = local_3680._8_8_;
      uStack_3470 = auStack_3670._0_8_;
      uStack_3468 = auStack_3670._8_8_;
      auVar17._16_8_ = auStack_3670._0_8_;
      auVar17._0_16_ = local_3680;
      auVar17._24_8_ = auStack_3670._8_8_;
      local_3220 = vpand_avx2(local_3460,auVar17);
      local_3240 = local_3640._0_8_;
      uStack_3238 = local_3640._8_8_;
      uStack_3230 = auStack_3630._0_8_;
      uStack_3228 = auStack_3630._8_8_;
      auVar32._16_8_ = auStack_3630._0_8_;
      auVar32._0_16_ = local_3640;
      auVar32._24_8_ = auStack_3630._8_8_;
      local_34c0 = vpor_avx2(local_3220,auVar32);
      local_38a0 = vpand_avx2(local_34a0,local_34c0);
      local_19e0 = vdivps_avx(auVar82,auVar78);
      local_1944 = 0x80000000;
      local_1920 = 0x80000000;
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      local_1940 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      auStack_1930 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      local_1a00 = local_1940._0_8_;
      uStack_19f8 = local_1940._8_8_;
      uStack_19f0 = auStack_1930._0_8_;
      uStack_19e8 = auStack_1930._8_8_;
      local_1948 = 0x3f800000;
      local_18e0 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      local_1900 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auStack_18f0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      local_1a20 = local_1900._0_8_;
      uStack_1a18 = local_1900._8_8_;
      uStack_1a10 = auStack_18f0._0_8_;
      uStack_1a08 = auStack_18f0._8_8_;
      local_194c = 0xbf800000;
      local_18a0 = 0xbf800000;
      auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
      local_18c0 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
      auStack_18b0 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
      local_1a40 = local_18c0._0_8_;
      uStack_1a38 = local_18c0._8_8_;
      uStack_1a30 = auStack_18b0._0_8_;
      uStack_1a28 = auStack_18b0._8_8_;
      local_1950 = 0x3fc90fdb;
      local_1860 = 0x3fc90fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      local_1880 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      auStack_1870 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      local_1a60 = local_1880._0_8_;
      uStack_1a58 = local_1880._8_8_;
      uStack_1a50 = auStack_1870._0_8_;
      uStack_1a48 = auStack_1870._8_8_;
      local_1954 = 0x3f800000;
      local_1820 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      local_1840 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auStack_1830 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      local_1a80 = local_1840._0_8_;
      uStack_1a78 = local_1840._8_8_;
      uStack_1a70 = auStack_1830._0_8_;
      uStack_1a68 = auStack_1830._8_8_;
      local_1958 = 0xbeaaaa53;
      local_17e0 = 0xbeaaaa53;
      auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
      local_1800 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
      auStack_17f0 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
      local_1aa0 = local_1800._0_8_;
      uStack_1a98 = local_1800._8_8_;
      uStack_1a90 = auStack_17f0._0_8_;
      uStack_1a88 = auStack_17f0._8_8_;
      local_195c = 0x3e4cb974;
      local_17a0 = 0x3e4cb974;
      auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
      local_17c0 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
      auStack_17b0 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
      local_1ac0 = local_17c0._0_8_;
      uStack_1ab8 = local_17c0._8_8_;
      uStack_1ab0 = auStack_17b0._0_8_;
      uStack_1aa8 = auStack_17b0._8_8_;
      local_1960 = 0xbe117200;
      local_1760 = 0xbe117200;
      auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
      local_1780 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
      auStack_1770 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
      local_1ae0 = local_1780._0_8_;
      uStack_1ad8 = local_1780._8_8_;
      uStack_1ad0 = auStack_1770._0_8_;
      uStack_1ac8 = auStack_1770._8_8_;
      local_1964 = 0x3dd9ed24;
      local_1720 = 0x3dd9ed24;
      auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
      local_1740 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
      auStack_1730 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
      local_1b00 = local_1740._0_8_;
      uStack_1af8 = local_1740._8_8_;
      uStack_1af0 = auStack_1730._0_8_;
      uStack_1ae8 = auStack_1730._8_8_;
      local_1968 = 0xbd99b01e;
      local_16e0 = 0xbd99b01e;
      auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
      local_1700 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
      auStack_16f0 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
      local_1b20 = local_1700._0_8_;
      uStack_1b18 = local_1700._8_8_;
      uStack_1b10 = auStack_16f0._0_8_;
      uStack_1b08 = auStack_16f0._8_8_;
      local_196c = 0x3d2edd4e;
      local_16a0 = 0x3d2edd4e;
      auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
      local_16c0 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
      auStack_16b0 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
      local_1b40 = local_16c0._0_8_;
      uStack_1b38 = local_16c0._8_8_;
      uStack_1b30 = auStack_16b0._0_8_;
      uStack_1b28 = auStack_16b0._8_8_;
      local_1970 = 0xbc83a25c;
      local_1660 = 0xbc83a25c;
      auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
      local_1680 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
      auStack_1670 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
      local_1b60 = local_1680._0_8_;
      uStack_1b58 = local_1680._8_8_;
      uStack_1b50 = auStack_1670._0_8_;
      uStack_1b48 = auStack_1670._8_8_;
      local_1974 = 0x3b3ac537;
      local_1620 = 0x3b3ac537;
      auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
      local_1640 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
      auStack_1630 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
      local_1b80 = local_1640._0_8_;
      uStack_1b78 = local_1640._8_8_;
      uStack_1b70 = auStack_1630._0_8_;
      uStack_1b68 = auStack_1630._8_8_;
      local_1360 = local_1940._0_8_;
      uStack_1358 = local_1940._8_8_;
      uStack_1350 = auStack_1930._0_8_;
      uStack_1348 = auStack_1930._8_8_;
      local_1380 = local_19e0._0_8_;
      uStack_1378 = local_19e0._8_8_;
      uStack_1370 = local_19e0._16_8_;
      uStack_1368 = local_19e0._24_8_;
      auVar53._16_8_ = auStack_1930._0_8_;
      auVar53._0_16_ = local_1940;
      auVar53._24_8_ = auStack_1930._8_8_;
      local_1ba0 = vpand_avx2(auVar53,local_19e0);
      local_ee0 = local_1940._0_8_;
      uStack_ed8 = local_1940._8_8_;
      uStack_ed0 = auStack_1930._0_8_;
      uStack_ec8 = auStack_1930._8_8_;
      local_f00 = local_19e0._0_8_;
      uStack_ef8 = local_19e0._8_8_;
      uStack_ef0 = local_19e0._16_8_;
      uStack_ee8 = local_19e0._24_8_;
      auVar56._16_8_ = auStack_1930._0_8_;
      auVar56._0_16_ = local_1940;
      auVar56._24_8_ = auStack_1930._8_8_;
      local_1bc0 = vpandn_avx2(auVar56,local_19e0);
      auVar50._16_8_ = auStack_18f0._0_8_;
      auVar50._0_16_ = local_1900;
      auVar50._24_8_ = auStack_18f0._8_8_;
      local_1be0 = vcmpps_avx(auVar50,local_1bc0,1);
      local_13a0 = local_1be0._0_8_;
      uStack_1398 = local_1be0._8_8_;
      uStack_1390 = local_1be0._16_8_;
      uStack_1388 = local_1be0._24_8_;
      local_13c0 = local_18c0._0_8_;
      uStack_13b8 = local_18c0._8_8_;
      uStack_13b0 = auStack_18b0._0_8_;
      uStack_13a8 = auStack_18b0._8_8_;
      auVar52._16_8_ = auStack_18b0._0_8_;
      auVar52._0_16_ = local_18c0;
      auVar52._24_8_ = auStack_18b0._8_8_;
      local_fa0 = vpand_avx2(local_1be0,auVar52);
      local_f20 = local_1be0._0_8_;
      uStack_f18 = local_1be0._8_8_;
      uStack_f10 = local_1be0._16_8_;
      uStack_f08 = local_1be0._24_8_;
      local_f40 = local_1bc0._0_8_;
      uStack_f38 = local_1bc0._8_8_;
      uStack_f30 = local_1bc0._16_8_;
      uStack_f28 = local_1bc0._24_8_;
      local_fc0 = vpandn_avx2(local_1be0,local_1bc0);
      local_1520 = vpor_avx2(local_fa0,local_fc0);
      local_13e0 = local_1be0._0_8_;
      uStack_13d8 = local_1be0._8_8_;
      uStack_13d0 = local_1be0._16_8_;
      uStack_13c8 = local_1be0._24_8_;
      local_1400 = local_1bc0._0_8_;
      uStack_13f8 = local_1bc0._8_8_;
      uStack_13f0 = local_1bc0._16_8_;
      uStack_13e8 = local_1bc0._24_8_;
      local_fe0 = vpand_avx2(local_1be0,local_1bc0);
      local_f60 = local_1be0._0_8_;
      uStack_f58 = local_1be0._8_8_;
      uStack_f50 = local_1be0._16_8_;
      uStack_f48 = local_1be0._24_8_;
      local_f80 = local_1900._0_8_;
      uStack_f78 = local_1900._8_8_;
      uStack_f70 = auStack_18f0._0_8_;
      uStack_f68 = auStack_18f0._8_8_;
      auVar55._16_8_ = auStack_18f0._0_8_;
      auVar55._0_16_ = local_1900;
      auVar55._24_8_ = auStack_18f0._8_8_;
      local_1000 = vpandn_avx2(local_1be0,auVar55);
      local_1540 = vpor_avx2(local_fe0,local_1000);
      local_1c00 = vdivps_avx(local_1520,local_1540);
      local_1580 = local_1c00._0_8_;
      uStack_1578 = local_1c00._8_8_;
      uStack_1570 = local_1c00._16_8_;
      uStack_1568 = local_1c00._24_8_;
      local_1560._0_4_ = local_1c00._0_4_;
      local_1560._4_4_ = local_1c00._4_4_;
      uStack_1558._0_4_ = local_1c00._8_4_;
      uStack_1558._4_4_ = local_1c00._12_4_;
      uStack_1550._0_4_ = local_1c00._16_4_;
      uStack_1550._4_4_ = local_1c00._20_4_;
      uStack_1548._0_4_ = local_1c00._24_4_;
      uStack_1548._4_4_ = local_1c00._28_4_;
      fStack_1c04 = uStack_1548._4_4_;
      local_1c20 = (float)local_1560 * (float)local_1560;
      fStack_1c1c = local_1560._4_4_ * local_1560._4_4_;
      fStack_1c18 = (float)uStack_1558 * (float)uStack_1558;
      fStack_1c14 = uStack_1558._4_4_ * uStack_1558._4_4_;
      fStack_1c10 = (float)uStack_1550 * (float)uStack_1550;
      fStack_1c0c = uStack_1550._4_4_ * uStack_1550._4_4_;
      fStack_1c08 = (float)uStack_1548 * (float)uStack_1548;
      local_15c0 = CONCAT44(fStack_1c1c,local_1c20);
      uStack_15b8 = CONCAT44(fStack_1c14,fStack_1c18);
      uStack_15b0 = CONCAT44(fStack_1c0c,fStack_1c10);
      uStack_15a8 = CONCAT44(uStack_1548._4_4_,fStack_1c08);
      fStack_1c24 = uStack_1548._4_4_;
      local_1c40 = local_1c20 * local_1c20;
      fStack_1c3c = fStack_1c1c * fStack_1c1c;
      fStack_1c38 = fStack_1c18 * fStack_1c18;
      fStack_1c34 = fStack_1c14 * fStack_1c14;
      fStack_1c30 = fStack_1c10 * fStack_1c10;
      fStack_1c2c = fStack_1c0c * fStack_1c0c;
      fStack_1c28 = fStack_1c08 * fStack_1c08;
      local_14d8 = &local_1c40;
      local_1450 = &local_1b60;
      local_1458 = &local_1b20;
      local_1300 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_12f8 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_12f0 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_12e8 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar100._4_4_ = fStack_1c3c;
      auVar100._0_4_ = local_1c40;
      auVar100._8_4_ = fStack_1c38;
      auVar100._12_4_ = fStack_1c34;
      auVar100._16_4_ = fStack_1c30;
      auVar100._20_4_ = fStack_1c2c;
      auVar100._24_4_ = fStack_1c28;
      auVar100._28_4_ = uStack_1548._4_4_;
      local_1320 = local_1680._0_8_;
      uStack_1318 = local_1680._8_8_;
      uStack_1310 = auStack_1670._0_8_;
      uStack_1308 = auStack_1670._8_8_;
      auVar109._16_8_ = auStack_1670._0_8_;
      auVar109._0_16_ = local_1680;
      auVar109._24_8_ = auStack_1670._8_8_;
      local_1340 = local_1700._0_8_;
      uStack_1338 = local_1700._8_8_;
      uStack_1330 = auStack_16f0._0_8_;
      uStack_1328 = auStack_16f0._8_8_;
      auVar111._16_8_ = auStack_16f0._0_8_;
      auVar111._0_16_ = local_1700;
      auVar111._24_8_ = auStack_16f0._8_8_;
      auVar3 = vfmadd213ps_fma(auVar109,auVar100,auVar111);
      local_1468 = local_1cc0;
      local_1470 = &local_1ae0;
      local_12a0 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_1298 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_1290 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_1288 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar101._4_4_ = fStack_1c3c;
      auVar101._0_4_ = local_1c40;
      auVar101._8_4_ = fStack_1c38;
      auVar101._12_4_ = fStack_1c34;
      auVar101._16_4_ = fStack_1c30;
      auVar101._20_4_ = fStack_1c2c;
      auVar101._24_4_ = fStack_1c28;
      auVar101._28_4_ = uStack_1548._4_4_;
      local_1cc0._0_8_ = auVar3._0_8_;
      local_12c0 = local_1cc0._0_8_;
      local_1cc0._8_8_ = auVar3._8_8_;
      uStack_12b8 = local_1cc0._8_8_;
      uStack_12b0 = 0;
      uStack_12a8 = 0;
      local_12e0 = local_1780._0_8_;
      uStack_12d8 = local_1780._8_8_;
      uStack_12d0 = auStack_1770._0_8_;
      uStack_12c8 = auStack_1770._8_8_;
      auVar113._16_8_ = auStack_1770._0_8_;
      auVar113._0_16_ = local_1780;
      auVar113._24_8_ = auStack_1770._8_8_;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar101,auVar113);
      local_1480 = local_1ca0;
      local_1488 = &local_1aa0;
      local_1240 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_1238 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_1230 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_1228 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar102._4_4_ = fStack_1c3c;
      auVar102._0_4_ = local_1c40;
      auVar102._8_4_ = fStack_1c38;
      auVar102._12_4_ = fStack_1c34;
      auVar102._16_4_ = fStack_1c30;
      auVar102._20_4_ = fStack_1c2c;
      auVar102._24_4_ = fStack_1c28;
      auVar102._28_4_ = uStack_1548._4_4_;
      local_1ca0._0_8_ = auVar20._0_8_;
      local_1260 = local_1ca0._0_8_;
      local_1ca0._8_8_ = auVar20._8_8_;
      uStack_1258 = local_1ca0._8_8_;
      uStack_1250 = 0;
      uStack_1248 = 0;
      local_1280 = local_1800._0_8_;
      uStack_1278 = local_1800._8_8_;
      uStack_1270 = auStack_17f0._0_8_;
      uStack_1268 = auStack_17f0._8_8_;
      auVar115._16_8_ = auStack_17f0._0_8_;
      auVar115._0_16_ = local_1800;
      auVar115._24_8_ = auStack_17f0._8_8_;
      auVar134 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar102,auVar115);
      local_1498 = &local_1b80;
      local_14a0 = &local_1b40;
      local_11e0 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_11d8 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_11d0 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_11c8 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar103._4_4_ = fStack_1c3c;
      auVar103._0_4_ = local_1c40;
      auVar103._8_4_ = fStack_1c38;
      auVar103._12_4_ = fStack_1c34;
      auVar103._16_4_ = fStack_1c30;
      auVar103._20_4_ = fStack_1c2c;
      auVar103._24_4_ = fStack_1c28;
      auVar103._28_4_ = uStack_1548._4_4_;
      local_1200 = local_1640._0_8_;
      uStack_11f8 = local_1640._8_8_;
      uStack_11f0 = auStack_1630._0_8_;
      uStack_11e8 = auStack_1630._8_8_;
      auVar108._16_8_ = auStack_1630._0_8_;
      auVar108._0_16_ = local_1640;
      auVar108._24_8_ = auStack_1630._8_8_;
      local_1220 = local_16c0._0_8_;
      uStack_1218 = local_16c0._8_8_;
      uStack_1210 = auStack_16b0._0_8_;
      uStack_1208 = auStack_16b0._8_8_;
      auVar110._16_8_ = auStack_16b0._0_8_;
      auVar110._0_16_ = local_16c0;
      auVar110._24_8_ = auStack_16b0._8_8_;
      auVar21 = vfmadd213ps_fma(auVar108,auVar103,auVar110);
      local_14b0 = local_1d40;
      local_14b8 = &local_1b00;
      local_1180 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_1178 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_1170 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_1168 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar104._4_4_ = fStack_1c3c;
      auVar104._0_4_ = local_1c40;
      auVar104._8_4_ = fStack_1c38;
      auVar104._12_4_ = fStack_1c34;
      auVar104._16_4_ = fStack_1c30;
      auVar104._20_4_ = fStack_1c2c;
      auVar104._24_4_ = fStack_1c28;
      auVar104._28_4_ = uStack_1548._4_4_;
      local_1d40._0_8_ = auVar21._0_8_;
      local_11a0 = local_1d40._0_8_;
      local_1d40._8_8_ = auVar21._8_8_;
      uStack_1198 = local_1d40._8_8_;
      uStack_1190 = 0;
      uStack_1188 = 0;
      local_11c0 = local_1740._0_8_;
      uStack_11b8 = local_1740._8_8_;
      uStack_11b0 = auStack_1730._0_8_;
      uStack_11a8 = auStack_1730._8_8_;
      auVar112._16_8_ = auStack_1730._0_8_;
      auVar112._0_16_ = local_1740;
      auVar112._24_8_ = auStack_1730._8_8_;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar104,auVar112);
      local_14c8 = local_1d20;
      local_14d0 = &local_1ac0;
      local_1120 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_1118 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_1110 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_1108 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar105._4_4_ = fStack_1c3c;
      auVar105._0_4_ = local_1c40;
      auVar105._8_4_ = fStack_1c38;
      auVar105._12_4_ = fStack_1c34;
      auVar105._16_4_ = fStack_1c30;
      auVar105._20_4_ = fStack_1c2c;
      auVar105._24_4_ = fStack_1c28;
      auVar105._28_4_ = uStack_1548._4_4_;
      local_1d20._0_8_ = auVar22._0_8_;
      local_1140 = local_1d20._0_8_;
      local_1d20._8_8_ = auVar22._8_8_;
      uStack_1138 = local_1d20._8_8_;
      uStack_1130 = 0;
      uStack_1128 = 0;
      local_1160 = local_17c0._0_8_;
      uStack_1158 = local_17c0._8_8_;
      uStack_1150 = auStack_17b0._0_8_;
      uStack_1148 = auStack_17b0._8_8_;
      auVar114._16_8_ = auStack_17b0._0_8_;
      auVar114._0_16_ = local_17c0;
      auVar114._24_8_ = auStack_17b0._8_8_;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar105,auVar114);
      local_14e0 = local_1d00;
      local_14e8 = &local_1a80;
      local_10c0 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_10b8 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_10b0 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_10a8 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar106._4_4_ = fStack_1c3c;
      auVar106._0_4_ = local_1c40;
      auVar106._8_4_ = fStack_1c38;
      auVar106._12_4_ = fStack_1c34;
      auVar106._16_4_ = fStack_1c30;
      auVar106._20_4_ = fStack_1c2c;
      auVar106._24_4_ = fStack_1c28;
      auVar106._28_4_ = uStack_1548._4_4_;
      local_1d00._0_8_ = auVar23._0_8_;
      local_10e0 = local_1d00._0_8_;
      local_1d00._8_8_ = auVar23._8_8_;
      uStack_10d8 = local_1d00._8_8_;
      uStack_10d0 = 0;
      uStack_10c8 = 0;
      local_1100 = local_1840._0_8_;
      uStack_10f8 = local_1840._8_8_;
      uStack_10f0 = auStack_1830._0_8_;
      uStack_10e8 = auStack_1830._8_8_;
      auVar116._16_8_ = auStack_1830._0_8_;
      auVar116._0_16_ = local_1840;
      auVar116._24_8_ = auStack_1830._8_8_;
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar106,auVar116);
      local_14f0 = &local_1c20;
      local_14f8 = local_1c80;
      local_1500 = local_1ce0;
      local_1060 = CONCAT44(fStack_1c1c,local_1c20);
      uStack_1058 = CONCAT44(fStack_1c14,fStack_1c18);
      uStack_1050 = CONCAT44(fStack_1c0c,fStack_1c10);
      uStack_1048 = CONCAT44(uStack_1548._4_4_,fStack_1c08);
      auVar107._4_4_ = fStack_1c1c;
      auVar107._0_4_ = local_1c20;
      auVar107._8_4_ = fStack_1c18;
      auVar107._12_4_ = fStack_1c14;
      auVar107._16_4_ = fStack_1c10;
      auVar107._20_4_ = fStack_1c0c;
      auVar107._24_4_ = fStack_1c08;
      auVar107._28_4_ = uStack_1548._4_4_;
      local_1c80._0_8_ = auVar134._0_8_;
      local_1080 = local_1c80._0_8_;
      local_1c80._8_8_ = auVar134._8_8_;
      uStack_1078 = local_1c80._8_8_;
      uStack_1070 = 0;
      uStack_1068 = 0;
      local_1ce0._0_8_ = auVar24._0_8_;
      local_10a0 = local_1ce0._0_8_;
      local_1ce0._8_8_ = auVar24._8_8_;
      uStack_1098 = local_1ce0._8_8_;
      uStack_1090 = 0;
      uStack_1088 = 0;
      auVar25 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar107,ZEXT1632(auVar24));
      local_1c60._0_8_ = auVar25._0_8_;
      local_1c60._8_8_ = auVar25._8_8_;
      uStack_15d0 = 0;
      uStack_15c8 = 0;
      local_1600 = local_1c00._0_8_;
      uStack_15f8 = local_1c00._8_8_;
      uStack_15f0 = local_1c00._16_8_;
      uStack_15e8 = local_1c00._24_8_;
      local_15e0._0_4_ = auVar25._0_4_;
      local_15e0._4_4_ = auVar25._4_4_;
      uStack_15d8._0_4_ = auVar25._8_4_;
      uStack_15d8._4_4_ = auVar25._12_4_;
      fStack_1984 = uStack_1548._4_4_;
      local_19a0 = (float)local_15e0 * (float)local_1560;
      fStack_199c = local_15e0._4_4_ * local_1560._4_4_;
      fStack_1998 = (float)uStack_15d8 * (float)uStack_1558;
      fStack_1994 = uStack_15d8._4_4_ * uStack_1558._4_4_;
      fStack_1990 = (float)uStack_1550 * 0.0;
      fStack_198c = uStack_1550._4_4_ * 0.0;
      fStack_1988 = (float)uStack_1548 * 0.0;
      local_1420 = local_1be0._0_8_;
      uStack_1418 = local_1be0._8_8_;
      uStack_1410 = local_1be0._16_8_;
      uStack_1408 = local_1be0._24_8_;
      local_1440 = local_1880._0_8_;
      uStack_1438 = local_1880._8_8_;
      uStack_1430 = auStack_1870._0_8_;
      uStack_1428 = auStack_1870._8_8_;
      auVar51._16_8_ = auStack_1870._0_8_;
      auVar51._0_16_ = local_1880;
      auVar51._24_8_ = auStack_1870._8_8_;
      _local_19c0 = vpand_avx2(local_1be0,auVar51);
      local_1020 = local_19a0 + (float)local_19c0._0_4_;
      fStack_101c = fStack_199c + (float)local_19c0._4_4_;
      fStack_1018 = fStack_1998 + fStack_19b8;
      fStack_1014 = fStack_1994 + fStack_19b4;
      fStack_1010 = fStack_1990 + fStack_19b0;
      fStack_100c = fStack_198c + fStack_19ac;
      fStack_1008 = fStack_1988 + fStack_19a8;
      fStack_1004 = uStack_1548._4_4_ + fStack_19a4;
      local_1040 = local_1ba0._0_8_;
      uStack_1038 = local_1ba0._8_8_;
      uStack_1030 = local_1ba0._16_8_;
      uStack_1028 = local_1ba0._24_8_;
      auVar54._4_4_ = fStack_101c;
      auVar54._0_4_ = local_1020;
      auVar54._8_4_ = fStack_1018;
      auVar54._12_4_ = fStack_1014;
      auVar54._16_4_ = fStack_1010;
      auVar54._20_4_ = fStack_100c;
      auVar54._24_4_ = fStack_1008;
      auVar54._28_4_ = fStack_1004;
      _local_3700 = vpor_avx2(auVar54,local_1ba0);
      local_3720._0_4_ = local_38a0._0_4_;
      local_3720._4_4_ = local_38a0._4_4_;
      uStack_3718._0_4_ = local_38a0._8_4_;
      uStack_3718._4_4_ = local_38a0._12_4_;
      uStack_3710._0_4_ = local_38a0._16_4_;
      uStack_3710._4_4_ = local_38a0._20_4_;
      uStack_3708._0_4_ = local_38a0._24_4_;
      uStack_3708._4_4_ = local_38a0._28_4_;
      local_38c0 = (float)local_3700._0_4_ + (float)local_3720;
      fStack_38bc = (float)local_3700._4_4_ + local_3720._4_4_;
      fStack_38b8 = fStack_36f8 + (float)uStack_3718;
      fStack_38b4 = fStack_36f4 + uStack_3718._4_4_;
      fStack_38b0 = fStack_36f0 + (float)uStack_3710;
      fStack_38ac = fStack_36ec + uStack_3710._4_4_;
      fStack_38a8 = fStack_36e8 + (float)uStack_3708;
      fStack_38a4 = fStack_36e4 + uStack_3708._4_4_;
      local_3260 = local_3860._0_8_;
      uStack_3258 = local_3860._8_8_;
      uStack_3250 = local_3860._16_8_;
      uStack_3248 = local_3860._24_8_;
      local_3280 = local_3640._0_8_;
      uStack_3278 = local_3640._8_8_;
      uStack_3270 = auStack_3630._0_8_;
      uStack_3268 = auStack_3630._8_8_;
      auVar31._16_8_ = auStack_3630._0_8_;
      auVar31._0_16_ = local_3640;
      auVar31._24_8_ = auStack_3630._8_8_;
      auVar135 = vpor_avx2(local_3860,auVar31);
      auVar14._16_8_ = auStack_36b0._0_8_;
      auVar14._0_16_ = local_36c0;
      auVar14._24_8_ = auStack_36b0._8_8_;
      local_38e0 = vcmpps_avx(auVar135,auVar14,1);
      local_34e0 = local_3820._0_8_;
      uStack_34d8 = local_3820._8_8_;
      uStack_34d0 = local_3820._16_8_;
      uStack_34c8 = local_3820._24_8_;
      local_32a0 = local_3880._0_8_;
      uStack_3298 = local_3880._8_8_;
      uStack_3290 = local_3880._16_8_;
      uStack_3288 = local_3880._24_8_;
      local_32c0 = local_3600._0_8_;
      uStack_32b8 = local_3600._8_8_;
      uStack_32b0 = auStack_35f0._0_8_;
      uStack_32a8 = auStack_35f0._8_8_;
      auVar30._16_8_ = auStack_35f0._0_8_;
      auVar30._0_16_ = local_3600;
      auVar30._24_8_ = auStack_35f0._8_8_;
      local_3500 = vpor_avx2(local_3880,auVar30);
      local_3320 = vpand_avx2(local_3820,local_3500);
      local_ce0 = local_3820._0_8_;
      uStack_cd8 = local_3820._8_8_;
      uStack_cd0 = local_3820._16_8_;
      uStack_cc8 = local_3820._24_8_;
      local_3520 = local_38e0._0_8_;
      uStack_3518 = local_38e0._8_8_;
      uStack_3510 = local_38e0._16_8_;
      uStack_3508 = local_38e0._24_8_;
      local_3540 = local_3640._0_8_;
      uStack_3538 = local_3640._8_8_;
      uStack_3530 = auStack_3630._0_8_;
      uStack_3528 = auStack_3630._8_8_;
      auVar16._16_8_ = auStack_3630._0_8_;
      auVar16._0_16_ = local_3640;
      auVar16._24_8_ = auStack_3630._8_8_;
      local_32e0 = vpand_avx2(local_38e0,auVar16);
      local_ca0 = local_38e0._0_8_;
      uStack_c98 = local_38e0._8_8_;
      uStack_c90 = local_38e0._16_8_;
      uStack_c88 = local_38e0._24_8_;
      local_cc0 = local_36c0._0_8_;
      uStack_cb8 = local_36c0._8_8_;
      uStack_cb0 = auStack_36b0._0_8_;
      uStack_ca8 = auStack_36b0._8_8_;
      auVar60._16_8_ = auStack_36b0._0_8_;
      auVar60._0_16_ = local_36c0;
      auVar60._24_8_ = auStack_36b0._8_8_;
      local_3300 = vpandn_avx2(local_38e0,auVar60);
      local_d00 = vpor_avx2(local_32e0,local_3300);
      local_3340 = vpandn_avx2(local_3820,local_d00);
      local_3900 = vpor_avx2(local_3320,local_3340);
      local_3560 = local_3840._0_8_;
      uStack_3558 = local_3840._8_8_;
      uStack_3550 = local_3840._16_8_;
      uStack_3548 = local_3840._24_8_;
      local_3580 = CONCAT44(fStack_38bc,local_38c0);
      uStack_3578 = CONCAT44(fStack_38b4,fStack_38b8);
      uStack_3570 = CONCAT44(fStack_38ac,fStack_38b0);
      uStack_3568 = CONCAT44(fStack_38a4,fStack_38a8);
      auVar15._8_8_ = uStack_3578;
      auVar15._0_8_ = local_3580;
      auVar15._16_8_ = uStack_3570;
      auVar15._24_8_ = uStack_3568;
      local_3360 = vpand_avx2(local_3840,auVar15);
      local_d20 = local_3840._0_8_;
      uStack_d18 = local_3840._8_8_;
      uStack_d10 = local_3840._16_8_;
      uStack_d08 = local_3840._24_8_;
      local_d40 = local_3900._0_8_;
      uStack_d38 = local_3900._8_8_;
      uStack_d30 = local_3900._16_8_;
      uStack_d28 = local_3900._24_8_;
      auVar135 = vpternlogq_avx512vl(local_3840,local_3840,local_3840,0xf);
      local_3380 = vpand_avx2(auVar135,local_3900);
      auVar135 = vpor_avx2(local_3360,local_3380);
      in_stack_ffffffffffffbf00 = auVar135._0_8_;
      in_stack_ffffffffffffbf08 = auVar135._8_8_;
      in_stack_ffffffffffffbf10 = auVar135._16_8_;
      in_stack_ffffffffffffbf18 = auVar135._24_8_;
      local_3c90 = local_3ea0;
      *(undefined8 *)*local_3ea0 = in_stack_ffffffffffffbf00;
      *(undefined8 *)(*local_3ea0 + 8) = in_stack_ffffffffffffbf08;
      *(undefined8 *)(*local_3ea0 + 0x10) = in_stack_ffffffffffffbf10;
      *(undefined8 *)(*local_3ea0 + 0x18) = in_stack_ffffffffffffbf18;
      local_3e98 = local_3e98 + 1;
      local_3ea0 = (undefined1 (*) [64])(*local_3ea0 + 0x20);
      in_stack_ffffffffffffbf20 = local_39e0._0_8_;
      in_stack_ffffffffffffbf28 = local_39e0._8_8_;
      in_stack_ffffffffffffbf30 = auStack_39d0._0_8_;
      in_stack_ffffffffffffbf38 = auStack_39d0._8_8_;
      local_3cc0 = in_stack_ffffffffffffbf00;
      uStack_3cb8 = in_stack_ffffffffffffbf08;
      uStack_3cb0 = in_stack_ffffffffffffbf10;
      uStack_3ca8 = in_stack_ffffffffffffbf18;
      local_39b0 = local_3a6c;
      local_39ac = local_3a6c;
      local_39a8 = local_3a6c;
      local_39a4 = local_3a6c;
      local_39a0 = local_3a6c;
      local_399c = local_3a6c;
      local_3998 = local_3a6c;
      local_3994 = local_3a6c;
      local_3720 = local_38a0._0_8_;
      uStack_3718 = local_38a0._8_8_;
      uStack_3710 = local_38a0._16_8_;
      uStack_3708 = local_38a0._24_8_;
      local_369c = local_36a0;
      local_3698 = local_36a0;
      local_3694 = local_36a0;
      local_3690 = local_36a0;
      local_368c = local_36a0;
      local_3688 = local_36a0;
      local_3684 = local_36a0;
      local_365c = local_3660;
      local_3658 = local_3660;
      local_3654 = local_3660;
      local_3650 = local_3660;
      local_364c = local_3660;
      local_3648 = local_3660;
      local_3644 = local_3660;
      local_361c = local_3620;
      local_3618 = local_3620;
      local_3614 = local_3620;
      local_3610 = local_3620;
      local_360c = local_3620;
      local_3608 = local_3620;
      local_3604 = local_3620;
      local_35dc = local_35e0;
      local_35d8 = local_35e0;
      local_35d4 = local_35e0;
      local_35d0 = local_35e0;
      local_35cc = local_35e0;
      local_35c8 = local_35e0;
      local_35c4 = local_35e0;
      local_35c0 = local_3760;
      uStack_35b8 = uStack_3758;
      uStack_35b0 = uStack_3750;
      uStack_35a8 = uStack_3748;
      local_35a0 = local_3740;
      uStack_3598 = uStack_3738;
      uStack_3590 = uStack_3730;
      uStack_3588 = uStack_3728;
      local_3440 = local_3740;
      uStack_3438 = uStack_3738;
      uStack_3430 = uStack_3730;
      uStack_3428 = uStack_3728;
      local_3400 = local_3760;
      uStack_33f8 = uStack_3758;
      uStack_33f0 = uStack_3750;
      uStack_33e8 = uStack_3748;
      local_1d40 = ZEXT1632(auVar21);
      local_1d20 = ZEXT1632(auVar22);
      local_1d00 = ZEXT1632(auVar23);
      local_1ce0 = ZEXT1632(auVar24);
      local_1cc0 = ZEXT1632(auVar3);
      local_1ca0 = ZEXT1632(auVar20);
      local_1c80 = ZEXT1632(auVar134);
      local_1c60 = ZEXT1632(auVar25);
      local_191c = local_1920;
      local_1918 = local_1920;
      local_1914 = local_1920;
      local_1910 = local_1920;
      local_190c = local_1920;
      local_1908 = local_1920;
      local_1904 = local_1920;
      local_18dc = local_18e0;
      local_18d8 = local_18e0;
      local_18d4 = local_18e0;
      local_18d0 = local_18e0;
      local_18cc = local_18e0;
      local_18c8 = local_18e0;
      local_18c4 = local_18e0;
      local_189c = local_18a0;
      local_1898 = local_18a0;
      local_1894 = local_18a0;
      local_1890 = local_18a0;
      local_188c = local_18a0;
      local_1888 = local_18a0;
      local_1884 = local_18a0;
      local_185c = local_1860;
      local_1858 = local_1860;
      local_1854 = local_1860;
      local_1850 = local_1860;
      local_184c = local_1860;
      local_1848 = local_1860;
      local_1844 = local_1860;
      local_181c = local_1820;
      local_1818 = local_1820;
      local_1814 = local_1820;
      local_1810 = local_1820;
      local_180c = local_1820;
      local_1808 = local_1820;
      local_1804 = local_1820;
      local_17dc = local_17e0;
      local_17d8 = local_17e0;
      local_17d4 = local_17e0;
      local_17d0 = local_17e0;
      local_17cc = local_17e0;
      local_17c8 = local_17e0;
      local_17c4 = local_17e0;
      local_179c = local_17a0;
      local_1798 = local_17a0;
      local_1794 = local_17a0;
      local_1790 = local_17a0;
      local_178c = local_17a0;
      local_1788 = local_17a0;
      local_1784 = local_17a0;
      local_175c = local_1760;
      local_1758 = local_1760;
      local_1754 = local_1760;
      local_1750 = local_1760;
      local_174c = local_1760;
      local_1748 = local_1760;
      local_1744 = local_1760;
      local_171c = local_1720;
      local_1718 = local_1720;
      local_1714 = local_1720;
      local_1710 = local_1720;
      local_170c = local_1720;
      local_1708 = local_1720;
      local_1704 = local_1720;
      local_16dc = local_16e0;
      local_16d8 = local_16e0;
      local_16d4 = local_16e0;
      local_16d0 = local_16e0;
      local_16cc = local_16e0;
      local_16c8 = local_16e0;
      local_16c4 = local_16e0;
      local_169c = local_16a0;
      local_1698 = local_16a0;
      local_1694 = local_16a0;
      local_1690 = local_16a0;
      local_168c = local_16a0;
      local_1688 = local_16a0;
      local_1684 = local_16a0;
      local_165c = local_1660;
      local_1658 = local_1660;
      local_1654 = local_1660;
      local_1650 = local_1660;
      local_164c = local_1660;
      local_1648 = local_1660;
      local_1644 = local_1660;
      local_161c = local_1620;
      local_1618 = local_1620;
      local_1614 = local_1620;
      local_1610 = local_1620;
      local_160c = local_1620;
      local_1608 = local_1620;
      local_1604 = local_1620;
      local_15e0 = local_1c60._0_8_;
      uStack_15d8 = local_1c60._8_8_;
      local_15a0 = local_15c0;
      uStack_1598 = uStack_15b8;
      uStack_1590 = uStack_15b0;
      uStack_1588 = uStack_15a8;
      local_1560 = local_1580;
      uStack_1558 = uStack_1578;
      uStack_1550 = uStack_1570;
      uStack_1548 = uStack_1568;
      local_14c0 = local_14d8;
      local_14a8 = local_14d8;
      local_1490 = local_14d8;
      local_1478 = local_14d8;
      local_1460 = local_14d8;
      local_1448 = local_14d8;
    }
  }
  if (local_3ea8 == 4) {
    iVar159 = 0;
    local_3c88 = local_3e90;
    local_4140 = *(undefined8 *)*local_3e90;
    uStackY_4138 = *(undefined8 *)(*local_3e90 + 8);
    auVar27._16_8_ = local_4140;
    auVar27._0_16_ = *(undefined1 (*) [16])*local_3e90;
    auVar27._24_8_ = uStackY_4138;
    local_4180 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStackY_4138,
                                               CONCAT816(local_4140,
                                                         *(undefined1 (*) [16])*local_3e90))),
                            auVar27,1);
    uStackY_4130 = local_4140;
    uStackY_4128 = uStackY_4138;
    local_4120 = local_4140;
    uStackY_4118 = uStackY_4138;
    local_3b50 = local_4140;
    uStack_3b48 = uStackY_4138;
    local_3b20 = local_4140;
    uStack_3b18 = uStackY_4138;
    uStack_3b10 = local_4140;
    uStack_3b08 = uStackY_4138;
    for (; iVar159 + 3 < local_3ea4; iVar159 = iVar159 + 4) {
      local_3ba0 = *local_3e98;
      local_41e0 = CONCAT44(local_3ba0,local_3ba0);
      uStackY_41d8 = CONCAT44(local_3ba0,local_3ba0);
      local_3bc0 = local_3e98[1];
      uStackY_41d0 = CONCAT44(local_3bc0,local_3bc0);
      uStackY_41c8 = CONCAT44(local_3bc0,local_3bc0);
      local_3be0 = local_3e98[2];
      local_4200 = CONCAT44(local_3be0,local_3be0);
      uStackY_41f8 = CONCAT44(local_3be0,local_3be0);
      local_3c00 = local_3e98[3];
      uStackY_41f0 = CONCAT44(local_3c00,local_3c00);
      uStackY_41e8 = CONCAT44(local_3c00,local_3c00);
      auVar26._8_8_ = uStackY_41f8;
      auVar26._0_8_ = local_4200;
      auVar26._16_8_ = uStackY_41f0;
      auVar26._24_8_ = uStackY_41e8;
      local_4240 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT824(uStackY_41c8,
                                                 CONCAT816(uStackY_41d0,
                                                           CONCAT88(uStackY_41d8,local_41e0)))),
                              auVar26,1);
      local_3980 = &local_3ea9;
      local_3988 = local_4180;
      local_3990 = local_4240;
      y_01[2] = (float)(int)in_stack_ffffffffffffbf40;
      y_01[3] = (float)(int)((ulong)in_stack_ffffffffffffbf40 >> 0x20);
      y_01[0] = (float)(int)in_stack_ffffffffffffbf38;
      y_01[1] = (float)(int)((ulong)in_stack_ffffffffffffbf38 >> 0x20);
      y_01[4] = (float)(int)in_stack_ffffffffffffbf48;
      y_01[5] = (float)(int)((ulong)in_stack_ffffffffffffbf48 >> 0x20);
      y_01[6] = (float)(int)in_stack_ffffffffffffbf50;
      y_01[7] = (float)(int)((ulong)in_stack_ffffffffffffbf50 >> 0x20);
      y_01[8] = (float)(int)in_stack_ffffffffffffbf58;
      y_01[9] = (float)(int)((ulong)in_stack_ffffffffffffbf58 >> 0x20);
      y_01[10] = (float)(int)in_stack_ffffffffffffbf60;
      y_01[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      y_01[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      y_01[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      y_01[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      y_01[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      x_01[1] = (float)iVar159;
      x_01[0] = (float)in_stack_ffffffffffffbef8;
      x_01[2] = (float)(int)in_stack_ffffffffffffbf00;
      x_01[3] = (float)(int)((ulong)in_stack_ffffffffffffbf00 >> 0x20);
      x_01[4] = (float)(int)in_stack_ffffffffffffbf08;
      x_01[5] = (float)(int)((ulong)in_stack_ffffffffffffbf08 >> 0x20);
      x_01[6] = (float)(int)in_stack_ffffffffffffbf10;
      x_01[7] = (float)(int)((ulong)in_stack_ffffffffffffbf10 >> 0x20);
      x_01[8] = (float)(int)in_stack_ffffffffffffbf18;
      x_01[9] = (float)(int)((ulong)in_stack_ffffffffffffbf18 >> 0x20);
      x_01[10] = (float)(int)in_stack_ffffffffffffbf20;
      x_01[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf20 >> 0x20);
      x_01[0xc] = (float)(int)in_stack_ffffffffffffbf28;
      x_01[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf28 >> 0x20);
      x_01[0xe] = (float)(int)in_stack_ffffffffffffbf30;
      x_01[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf30 >> 0x20);
      uVar139 = local_4180._0_8_;
      uVar144 = local_4180._8_8_;
      uVar149 = local_4180._16_8_;
      uVar154 = local_4180._24_8_;
      uVar155 = local_4180._32_8_;
      uVar156 = local_4180._40_8_;
      uVar157 = local_4180._48_8_;
      uVar158 = local_4180._56_8_;
      local_41c0 = uStackY_41f0;
      uStackY_41b8 = uStackY_41e8;
      local_41b0 = local_4200;
      uStackY_41a8 = uStackY_41f8;
      local_41a0 = uStackY_41d0;
      uStackY_4198 = uStackY_41c8;
      local_4190 = local_41e0;
      uStackY_4188 = uStackY_41d8;
      uStack_3bfc = local_3c00;
      uStack_3bf8 = local_3c00;
      uStack_3bf4 = local_3c00;
      local_3be4 = local_3c00;
      uStack_3bdc = local_3be0;
      uStack_3bd8 = local_3be0;
      uStack_3bd4 = local_3be0;
      local_3bc4 = local_3be0;
      uStack_3bbc = local_3bc0;
      uStack_3bb8 = local_3bc0;
      uStack_3bb4 = local_3bc0;
      local_3ba4 = local_3bc0;
      uStack_3b9c = local_3ba0;
      uStack_3b98 = local_3ba0;
      uStack_3b94 = local_3ba0;
      local_3b84 = local_3ba0;
      local_3b70 = local_4200;
      uStack_3b68 = uStackY_41f8;
      local_3b60 = local_41e0;
      uStack_3b58 = uStackY_41d8;
      local_3b40 = local_41e0;
      uStack_3b38 = uStackY_41d8;
      uStack_3b30 = uStackY_41d0;
      uStack_3b28 = uStackY_41c8;
      atan2512_ps(y_01,x_01);
      local_3e08 = local_3ea0;
      auVar28._8_8_ = uVar144;
      auVar28._0_8_ = uVar139;
      auVar28._16_8_ = uVar149;
      auVar28._24_8_ = uVar154;
      auVar28._32_8_ = uVar155;
      auVar28._40_8_ = uVar156;
      auVar28._48_8_ = uVar157;
      auVar28._56_8_ = uVar158;
      *local_3ea0 = auVar28;
      local_3e98 = local_3e98 + 4;
      local_3ea0 = local_3ea0 + 1;
      local_3e80 = uVar139;
      uStack_3e78 = uVar144;
      uStack_3e70 = uVar149;
      uStack_3e68 = uVar154;
      uStack_3e60 = uVar155;
      uStack_3e58 = uVar156;
      uStack_3e50 = uVar157;
      uStack_3e48 = uVar158;
    }
    for (; iVar159 + 1 < local_3ea4; iVar159 = iVar159 + 2) {
      uVar1 = *local_3e98;
      uVar149 = CONCAT44(uVar1,uVar1);
      uVar154 = CONCAT44(uVar1,uVar1);
      uVar1 = local_3e98[1];
      uVar139 = CONCAT44(uVar1,uVar1);
      uVar144 = CONCAT44(uVar1,uVar1);
      auVar71._8_8_ = uStackY_4138;
      auVar71._0_8_ = local_4140;
      auVar71._16_8_ = uStackY_4130;
      auVar71._24_8_ = uStackY_4128;
      auVar70._8_8_ = uStackY_4138;
      auVar70._0_8_ = local_4140;
      auVar70._16_8_ = uStackY_4130;
      auVar70._24_8_ = uStackY_4128;
      auVar69._8_8_ = uStackY_4138;
      auVar69._0_8_ = local_4140;
      auVar69._16_8_ = uStackY_4130;
      auVar69._24_8_ = uStackY_4128;
      auVar68._8_8_ = uStackY_4138;
      auVar68._0_8_ = local_4140;
      auVar68._16_8_ = uStackY_4130;
      auVar68._24_8_ = uStackY_4128;
      auVar67._8_8_ = uVar154;
      auVar67._0_8_ = uVar149;
      auVar67._16_8_ = uVar139;
      auVar67._24_8_ = uVar144;
      auVar66._8_8_ = uVar154;
      auVar66._0_8_ = uVar149;
      auVar66._16_8_ = uVar139;
      auVar66._24_8_ = uVar144;
      auVar65._8_8_ = uVar154;
      auVar65._0_8_ = uVar149;
      auVar65._16_8_ = uVar139;
      auVar65._24_8_ = uVar144;
      auVar64._8_8_ = uVar154;
      auVar64._0_8_ = uVar149;
      auVar64._16_8_ = uVar139;
      auVar64._24_8_ = uVar144;
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0),0x30);
      uStack_2fb0 = auVar20._0_8_;
      uStack_2fa8 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x30);
      auVar134 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar134 = vinsertps_avx(auVar134,ZEXT416(0x80000000),0x20);
      auVar134 = vinsertps_avx(auVar134,ZEXT416(0x80000000),0x30);
      uStack_2f70 = auVar134._0_8_;
      uStack_2f68 = auVar134._8_8_;
      auVar134 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar134 = vinsertps_avx(auVar134,ZEXT416(0x40490fdb),0x20);
      auVar134 = vinsertps_avx(auVar134,ZEXT416(0x40490fdb),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x40490fdb),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x40490fdb),0x30);
      uStack_2f30 = auVar21._0_8_;
      uStack_2f28 = auVar21._8_8_;
      auVar21 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3fc90fdb),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3fc90fdb),0x30);
      uStack_2ef0 = auVar22._0_8_;
      uStack_2ee8 = auVar22._8_8_;
      auVar33._16_8_ = uStack_2fb0;
      auVar33._0_16_ = auVar3;
      auVar33._24_8_ = uStack_2fa8;
      auVar135 = vcmpps_avx(auVar64,auVar33,4);
      auVar34._16_8_ = uStack_2fb0;
      auVar34._0_16_ = auVar3;
      auVar34._24_8_ = uStack_2fa8;
      auVar2 = vcmpps_avx(auVar68,auVar34,4);
      auVar13 = vpand_avx2(auVar135,auVar2);
      auVar41._16_8_ = uStack_2f70;
      auVar41._0_16_ = auVar20;
      auVar41._24_8_ = uStack_2f68;
      auVar14 = vpand_avx2(auVar41,auVar65);
      auVar40._16_8_ = uStack_2f70;
      auVar40._0_16_ = auVar20;
      auVar40._24_8_ = uStack_2f68;
      auVar15 = vpand_avx2(auVar40,auVar69);
      auVar35._16_8_ = uStack_2fb0;
      auVar35._0_16_ = auVar3;
      auVar35._24_8_ = uStack_2fa8;
      auVar135 = vcmpps_avx(auVar66,auVar35,1);
      auVar136 = vcmpps_avx(auVar70,auVar35,1);
      auVar39._16_8_ = uStack_2f70;
      auVar39._0_16_ = auVar20;
      auVar39._24_8_ = uStack_2f68;
      auVar136 = vpand_avx2(auVar136,auVar39);
      auVar44._16_8_ = uStack_2f30;
      auVar44._0_16_ = auVar134;
      auVar44._24_8_ = uStack_2f28;
      auVar136 = vpor_avx2(auVar136,auVar44);
      auVar16 = vpand_avx2(auVar135,auVar136);
      auVar135 = vdivps_avx(auVar71,auVar67);
      auVar20 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x80000000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x80000000),0x30);
      uStack_26f0 = auVar22._0_8_;
      uStack_26e8 = auVar22._8_8_;
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x30);
      uStack_26b0 = auVar23._0_8_;
      uStack_26a8 = auVar23._8_8_;
      auVar23 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbf800000),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbf800000),0x30);
      uStack_2670 = auVar24._0_8_;
      uStack_2668 = auVar24._8_8_;
      auVar24 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3fc90fdb),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3fc90fdb),0x30);
      uStack_2630 = auVar25._0_8_;
      uStack_2628 = auVar25._8_8_;
      auVar25 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x30);
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      uStack_25f0 = auVar4._0_8_;
      uStack_25e8 = auVar4._8_8_;
      auVar4 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0xbeaaaa53),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0xbeaaaa53),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0xbeaaaa53),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0xbeaaaa53),0x30);
      uStack_25b0 = auVar5._0_8_;
      uStack_25a8 = auVar5._8_8_;
      auVar5 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3e4cb974),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3e4cb974),0x30);
      auVar6 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3e4cb974),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3e4cb974),0x30);
      uStack_2570 = auVar6._0_8_;
      uStack_2568 = auVar6._8_8_;
      auVar6 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0xbe117200),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0xbe117200),0x30);
      auVar7 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbe117200),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbe117200),0x30);
      uStack_2530 = auVar7._0_8_;
      uStack_2528 = auVar7._8_8_;
      auVar7 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3dd9ed24),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3dd9ed24),0x30);
      auVar8 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3dd9ed24),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3dd9ed24),0x30);
      uStack_24f0 = auVar8._0_8_;
      uStack_24e8 = auVar8._8_8_;
      auVar8 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbd99b01e),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbd99b01e),0x30);
      auVar9 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbd99b01e),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbd99b01e),0x30);
      uStack_24b0 = auVar9._0_8_;
      uStack_24a8 = auVar9._8_8_;
      auVar9 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3d2edd4e),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3d2edd4e),0x30);
      auVar10 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3d2edd4e),0x20);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3d2edd4e),0x30);
      uStack_2470 = auVar10._0_8_;
      uStack_2468 = auVar10._8_8_;
      auVar10 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbc83a25c),0x20);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbc83a25c),0x30);
      auVar11 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0xbc83a25c),0x20);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0xbc83a25c),0x30);
      uStack_2430 = auVar11._0_8_;
      uStack_2428 = auVar11._8_8_;
      auVar11 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3b3ac537),0x20);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3b3ac537),0x30);
      auVar12 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3b3ac537),0x20);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3b3ac537),0x30);
      uStack_23f0 = auVar12._0_8_;
      uStack_23e8 = auVar12._8_8_;
      auVar48._16_8_ = uStack_26f0;
      auVar48._0_16_ = auVar20;
      auVar48._24_8_ = uStack_26e8;
      auVar17 = vpand_avx2(auVar48,auVar135);
      auVar58._16_8_ = uStack_26f0;
      auVar58._0_16_ = auVar20;
      auVar58._24_8_ = uStack_26e8;
      auVar18 = vpandn_avx2(auVar58,auVar135);
      auVar45._16_8_ = uStack_26b0;
      auVar45._0_16_ = auVar22;
      auVar45._24_8_ = uStack_26a8;
      auVar135 = vcmpps_avx(auVar45,auVar18,1);
      auVar47._16_8_ = uStack_2670;
      auVar47._0_16_ = auVar23;
      auVar47._24_8_ = uStack_2668;
      auVar136 = vpand_avx2(auVar135,auVar47);
      auVar19 = vpandn_avx2(auVar135,auVar18);
      auVar19 = vpor_avx2(auVar136,auVar19);
      auVar136 = vpand_avx2(auVar135,auVar18);
      auVar57._16_8_ = uStack_26b0;
      auVar57._0_16_ = auVar22;
      auVar57._24_8_ = uStack_26a8;
      auVar18 = vpandn_avx2(auVar135,auVar57);
      auVar136 = vpor_avx2(auVar136,auVar18);
      auVar136 = vdivps_avx(auVar19,auVar136);
      local_2320 = auVar136._0_4_;
      fStack_231c = auVar136._4_4_;
      fStack_2318 = auVar136._8_4_;
      fStack_2314 = auVar136._12_4_;
      fStack_2310 = auVar136._16_4_;
      fStack_230c = auVar136._20_4_;
      fStack_2308 = auVar136._24_4_;
      fStack_2304 = auVar136._28_4_;
      fVar137 = local_2320 * local_2320;
      fVar140 = fStack_231c * fStack_231c;
      fVar142 = fStack_2318 * fStack_2318;
      fVar145 = fStack_2314 * fStack_2314;
      fVar147 = fStack_2310 * fStack_2310;
      fVar150 = fStack_230c * fStack_230c;
      fVar152 = fStack_2308 * fStack_2308;
      fVar138 = fVar137 * fVar137;
      fVar141 = fVar140 * fVar140;
      fVar143 = fVar142 * fVar142;
      fVar146 = fVar145 * fVar145;
      fVar148 = fVar147 * fVar147;
      fVar151 = fVar150 * fVar150;
      fVar153 = fVar152 * fVar152;
      auVar83._4_4_ = fVar141;
      auVar83._0_4_ = fVar138;
      auVar83._8_4_ = fVar143;
      auVar83._12_4_ = fVar146;
      auVar83._16_4_ = fVar148;
      auVar83._20_4_ = fVar151;
      auVar83._24_4_ = fVar153;
      auVar83._28_4_ = fStack_2304;
      auVar92._16_8_ = uStack_2430;
      auVar92._0_16_ = auVar10;
      auVar92._24_8_ = uStack_2428;
      auVar94._16_8_ = uStack_24b0;
      auVar94._0_16_ = auVar8;
      auVar94._24_8_ = uStack_24a8;
      auVar20 = vfmadd213ps_fma(auVar92,auVar83,auVar94);
      auVar84._4_4_ = fVar141;
      auVar84._0_4_ = fVar138;
      auVar84._8_4_ = fVar143;
      auVar84._12_4_ = fVar146;
      auVar84._16_4_ = fVar148;
      auVar84._20_4_ = fVar151;
      auVar84._24_4_ = fVar153;
      auVar84._28_4_ = fStack_2304;
      auVar96._16_8_ = uStack_2530;
      auVar96._0_16_ = auVar6;
      auVar96._24_8_ = uStack_2528;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar84,auVar96);
      auVar85._4_4_ = fVar141;
      auVar85._0_4_ = fVar138;
      auVar85._8_4_ = fVar143;
      auVar85._12_4_ = fVar146;
      auVar85._16_4_ = fVar148;
      auVar85._20_4_ = fVar151;
      auVar85._24_4_ = fVar153;
      auVar85._28_4_ = fStack_2304;
      auVar98._16_8_ = uStack_25b0;
      auVar98._0_16_ = auVar4;
      auVar98._24_8_ = uStack_25a8;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar85,auVar98);
      auVar86._4_4_ = fVar141;
      auVar86._0_4_ = fVar138;
      auVar86._8_4_ = fVar143;
      auVar86._12_4_ = fVar146;
      auVar86._16_4_ = fVar148;
      auVar86._20_4_ = fVar151;
      auVar86._24_4_ = fVar153;
      auVar86._28_4_ = fStack_2304;
      auVar91._16_8_ = uStack_23f0;
      auVar91._0_16_ = auVar11;
      auVar91._24_8_ = uStack_23e8;
      auVar93._16_8_ = uStack_2470;
      auVar93._0_16_ = auVar9;
      auVar93._24_8_ = uStack_2468;
      auVar22 = vfmadd213ps_fma(auVar91,auVar86,auVar93);
      auVar87._4_4_ = fVar141;
      auVar87._0_4_ = fVar138;
      auVar87._8_4_ = fVar143;
      auVar87._12_4_ = fVar146;
      auVar87._16_4_ = fVar148;
      auVar87._20_4_ = fVar151;
      auVar87._24_4_ = fVar153;
      auVar87._28_4_ = fStack_2304;
      auVar95._16_8_ = uStack_24f0;
      auVar95._0_16_ = auVar7;
      auVar95._24_8_ = uStack_24e8;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar87,auVar95);
      auVar88._4_4_ = fVar141;
      auVar88._0_4_ = fVar138;
      auVar88._8_4_ = fVar143;
      auVar88._12_4_ = fVar146;
      auVar88._16_4_ = fVar148;
      auVar88._20_4_ = fVar151;
      auVar88._24_4_ = fVar153;
      auVar88._28_4_ = fStack_2304;
      auVar97._16_8_ = uStack_2570;
      auVar97._0_16_ = auVar5;
      auVar97._24_8_ = uStack_2568;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar88,auVar97);
      auVar89._4_4_ = fVar141;
      auVar89._0_4_ = fVar138;
      auVar89._8_4_ = fVar143;
      auVar89._12_4_ = fVar146;
      auVar89._16_4_ = fVar148;
      auVar89._20_4_ = fVar151;
      auVar89._24_4_ = fVar153;
      auVar89._28_4_ = fStack_2304;
      auVar99._16_8_ = uStack_25f0;
      auVar99._0_16_ = auVar25;
      auVar99._24_8_ = uStack_25e8;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar89,auVar99);
      auVar90._4_4_ = fVar140;
      auVar90._0_4_ = fVar137;
      auVar90._8_4_ = fVar142;
      auVar90._12_4_ = fVar145;
      auVar90._16_4_ = fVar147;
      auVar90._20_4_ = fVar150;
      auVar90._24_4_ = fVar152;
      auVar90._28_4_ = fStack_2304;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar90,ZEXT1632(auVar22));
      local_23a0 = auVar20._0_4_;
      fStack_239c = auVar20._4_4_;
      fStack_2398 = auVar20._8_4_;
      fStack_2394 = auVar20._12_4_;
      auVar46._16_8_ = uStack_2630;
      auVar46._0_16_ = auVar24;
      auVar46._24_8_ = uStack_2628;
      auVar135 = vpand_avx2(auVar135,auVar46);
      local_2780 = auVar135._0_4_;
      fStack_277c = auVar135._4_4_;
      fStack_2778 = auVar135._8_4_;
      fStack_2774 = auVar135._12_4_;
      fStack_2770 = auVar135._16_4_;
      fStack_276c = auVar135._20_4_;
      fStack_2768 = auVar135._24_4_;
      fStack_2764 = auVar135._28_4_;
      auVar49._4_4_ = fStack_239c * fStack_231c + fStack_277c;
      auVar49._0_4_ = local_23a0 * local_2320 + local_2780;
      auVar49._8_4_ = fStack_2398 * fStack_2318 + fStack_2778;
      auVar49._12_4_ = fStack_2394 * fStack_2314 + fStack_2774;
      auVar49._16_4_ = fStack_2310 * 0.0 + fStack_2770;
      auVar49._20_4_ = fStack_230c * 0.0 + fStack_276c;
      auVar49._24_4_ = fStack_2308 * 0.0 + fStack_2768;
      auVar49._28_4_ = fStack_2304 + fStack_2764;
      auVar135 = vpor_avx2(auVar49,auVar17);
      local_3000 = auVar135._0_4_;
      fStack_2ffc = auVar135._4_4_;
      fStack_2ff8 = auVar135._8_4_;
      fStack_2ff4 = auVar135._12_4_;
      fStack_2ff0 = auVar135._16_4_;
      fStack_2fec = auVar135._20_4_;
      fStack_2fe8 = auVar135._24_4_;
      fStack_2fe4 = auVar135._28_4_;
      local_3020 = auVar16._0_4_;
      fStack_301c = auVar16._4_4_;
      fStack_3018 = auVar16._8_4_;
      fStack_3014 = auVar16._12_4_;
      fStack_3010 = auVar16._16_4_;
      fStack_300c = auVar16._20_4_;
      fStack_3008 = auVar16._24_4_;
      fStack_3004 = auVar16._28_4_;
      auVar43._16_8_ = uStack_2f30;
      auVar43._0_16_ = auVar134;
      auVar43._24_8_ = uStack_2f28;
      auVar135 = vpor_avx2(auVar14,auVar43);
      auVar36._16_8_ = uStack_2fb0;
      auVar36._0_16_ = auVar3;
      auVar36._24_8_ = uStack_2fa8;
      auVar135 = vcmpps_avx(auVar135,auVar36,1);
      auVar42._16_8_ = uStack_2ef0;
      auVar42._0_16_ = auVar21;
      auVar42._24_8_ = uStack_2ee8;
      auVar136 = vpor_avx2(auVar15,auVar42);
      auVar136 = vpand_avx2(auVar2,auVar136);
      auVar38._16_8_ = uStack_2f30;
      auVar38._0_16_ = auVar134;
      auVar38._24_8_ = uStack_2f28;
      auVar14 = vpand_avx2(auVar135,auVar38);
      auVar59._16_8_ = uStack_2fb0;
      auVar59._0_16_ = auVar3;
      auVar59._24_8_ = uStack_2fa8;
      auVar135 = vpandn_avx2(auVar135,auVar59);
      auVar135 = vpor_avx2(auVar14,auVar135);
      auVar135 = vpandn_avx2(auVar2,auVar135);
      auVar2 = vpor_avx2(auVar136,auVar135);
      auVar37._4_4_ = fStack_2ffc + fStack_301c;
      auVar37._0_4_ = local_3000 + local_3020;
      auVar37._12_4_ = fStack_2ff4 + fStack_3014;
      auVar37._8_4_ = fStack_2ff8 + fStack_3018;
      auVar37._20_4_ = fStack_2fec + fStack_300c;
      auVar37._16_4_ = fStack_2ff0 + fStack_3010;
      auVar37._28_4_ = fStack_2fe4 + fStack_3004;
      auVar37._24_4_ = fStack_2fe8 + fStack_3008;
      auVar135 = vpand_avx2(auVar13,auVar37);
      auVar136 = vpternlogq_avx512vl(auVar13,auVar13,auVar13,0xf);
      auVar2 = vpand_avx2(auVar136,auVar2);
      auVar135 = vpor_avx2(auVar135,auVar2);
      local_42e0 = auVar135._0_8_;
      uStackY_42d8 = auVar135._8_8_;
      uStackY_42d0 = auVar135._16_8_;
      uStackY_42c8 = auVar135._24_8_;
      *(undefined8 *)*local_3ea0 = local_42e0;
      *(undefined8 *)(*local_3ea0 + 8) = uStackY_42d8;
      *(undefined8 *)(*local_3ea0 + 0x10) = uStackY_42d0;
      *(undefined8 *)(*local_3ea0 + 0x18) = uStackY_42c8;
      local_3e98 = local_3e98 + 2;
      local_3ea0 = (undefined1 (*) [64])(*local_3ea0 + 0x20);
    }
    for (; iVar159 < local_3ea4; iVar159 = iVar159 + 1) {
      uVar1 = *local_3e98;
      uVar139 = CONCAT44(uVar1,uVar1);
      uVar144 = CONCAT44(uVar1,uVar1);
      auVar74._8_8_ = uStackY_4118;
      auVar74._0_8_ = local_4120;
      auVar73._8_8_ = uStackY_4118;
      auVar73._0_8_ = local_4120;
      auVar72._8_8_ = uStackY_4118;
      auVar72._0_8_ = local_4120;
      auVar21._8_8_ = uStackY_4118;
      auVar21._0_8_ = local_4120;
      auVar63._8_8_ = uVar144;
      auVar63._0_8_ = uVar139;
      auVar62._8_8_ = uVar144;
      auVar62._0_8_ = uVar139;
      auVar61._8_8_ = uVar144;
      auVar61._0_8_ = uVar139;
      auVar20._8_8_ = uVar144;
      auVar20._0_8_ = uVar139;
      auVar3 = vcmpps_avx(auVar20,ZEXT816(0),4);
      auVar20 = vcmpps_avx(auVar21,ZEXT816(0),4);
      auVar21 = vpand_avx(auVar3,auVar20);
      auVar23._8_8_ = 0x8000000080000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar22 = vpand_avx(auVar23,auVar61);
      auVar134._8_8_ = 0x8000000080000000;
      auVar134._0_8_ = 0x8000000080000000;
      auVar23 = vpand_avx(auVar134,auVar72);
      auVar3 = vcmpps_avx(auVar62,ZEXT816(0),1);
      auVar134 = vcmpps_avx(auVar73,ZEXT816(0),1);
      auVar24._8_8_ = 0x8000000080000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar134 = vpand_avx(auVar134,auVar24);
      auVar5._8_8_ = 0x40490fdb40490fdb;
      auVar5._0_8_ = 0x40490fdb40490fdb;
      auVar134 = vpor_avx(auVar134,auVar5);
      auVar24 = vpand_avx(auVar3,auVar134);
      auVar3 = vdivps_avx(auVar74,auVar63);
      auVar8._8_8_ = 0x8000000080000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar25 = vpand_avx(auVar8,auVar3);
      auVar12._8_8_ = 0x8000000080000000;
      auVar12._0_8_ = 0x8000000080000000;
      auVar4 = vpandn_avx(auVar12,auVar3);
      auVar10._8_8_ = 0x3f8000003f800000;
      auVar10._0_8_ = 0x3f8000003f800000;
      auVar3 = vcmpps_avx(auVar10,auVar4,1);
      auVar7._8_8_ = 0xbf800000bf800000;
      auVar7._0_8_ = 0xbf800000bf800000;
      auVar134 = vpand_avx(auVar3,auVar7);
      auVar5 = vpandn_avx(auVar3,auVar4);
      auVar5 = vpor_avx(auVar134,auVar5);
      auVar134 = vpand_avx(auVar3,auVar4);
      auVar11._8_8_ = 0x3f8000003f800000;
      auVar11._0_8_ = 0x3f8000003f800000;
      auVar4 = vpandn_avx(auVar3,auVar11);
      auVar134 = vpor_avx(auVar134,auVar4);
      auVar134 = vdivps_avx(auVar5,auVar134);
      local_630 = auVar134._0_4_;
      fStack_62c = auVar134._4_4_;
      fStack_628 = auVar134._8_4_;
      fStack_624 = auVar134._12_4_;
      fVar137 = local_630 * local_630;
      fVar140 = fStack_62c * fStack_62c;
      fVar142 = fStack_628 * fStack_628;
      fVar145 = fStack_624 * fStack_624;
      fVar138 = fVar137 * fVar137;
      fVar141 = fVar140 * fVar140;
      fVar143 = fVar142 * fVar142;
      fVar146 = fVar145 * fVar145;
      auVar117._4_4_ = fVar141;
      auVar117._0_4_ = fVar138;
      auVar117._8_4_ = fVar143;
      auVar117._12_4_ = fVar146;
      auVar126._8_8_ = 0xbc83a25cbc83a25c;
      auVar126._0_8_ = 0xbc83a25cbc83a25c;
      auVar128._8_8_ = 0xbd99b01ebd99b01e;
      auVar128._0_8_ = 0xbd99b01ebd99b01e;
      auVar134 = vfmadd213ps_fma(auVar126,auVar117,auVar128);
      auVar118._4_4_ = fVar141;
      auVar118._0_4_ = fVar138;
      auVar118._8_4_ = fVar143;
      auVar118._12_4_ = fVar146;
      auVar130._8_8_ = 0xbe117200be117200;
      auVar130._0_8_ = 0xbe117200be117200;
      auVar134 = vfmadd213ps_fma(auVar134,auVar118,auVar130);
      auVar119._4_4_ = fVar141;
      auVar119._0_4_ = fVar138;
      auVar119._8_4_ = fVar143;
      auVar119._12_4_ = fVar146;
      auVar132._8_8_ = 0xbeaaaa53beaaaa53;
      auVar132._0_8_ = 0xbeaaaa53beaaaa53;
      auVar134 = vfmadd213ps_fma(auVar134,auVar119,auVar132);
      auVar120._4_4_ = fVar141;
      auVar120._0_4_ = fVar138;
      auVar120._8_4_ = fVar143;
      auVar120._12_4_ = fVar146;
      auVar125._8_8_ = 0x3b3ac5373b3ac537;
      auVar125._0_8_ = 0x3b3ac5373b3ac537;
      auVar127._8_8_ = 0x3d2edd4e3d2edd4e;
      auVar127._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar4 = vfmadd213ps_fma(auVar125,auVar120,auVar127);
      auVar121._4_4_ = fVar141;
      auVar121._0_4_ = fVar138;
      auVar121._8_4_ = fVar143;
      auVar121._12_4_ = fVar146;
      auVar129._8_8_ = 0x3dd9ed243dd9ed24;
      auVar129._0_8_ = 0x3dd9ed243dd9ed24;
      auVar4 = vfmadd213ps_fma(auVar4,auVar121,auVar129);
      auVar122._4_4_ = fVar141;
      auVar122._0_4_ = fVar138;
      auVar122._8_4_ = fVar143;
      auVar122._12_4_ = fVar146;
      auVar131._8_8_ = 0x3e4cb9743e4cb974;
      auVar131._0_8_ = 0x3e4cb9743e4cb974;
      auVar4 = vfmadd213ps_fma(auVar4,auVar122,auVar131);
      auVar123._4_4_ = fVar141;
      auVar123._0_4_ = fVar138;
      auVar123._8_4_ = fVar143;
      auVar123._12_4_ = fVar146;
      auVar133._8_8_ = 0x3f8000003f800000;
      auVar133._0_8_ = 0x3f8000003f800000;
      auVar4 = vfmadd213ps_fma(auVar4,auVar123,auVar133);
      auVar124._4_4_ = fVar140;
      auVar124._0_4_ = fVar137;
      auVar124._8_4_ = fVar142;
      auVar124._12_4_ = fVar145;
      auVar134 = vfmadd213ps_fma(auVar134,auVar124,auVar4);
      local_670 = auVar134._0_4_;
      fStack_66c = auVar134._4_4_;
      fStack_668 = auVar134._8_4_;
      fStack_664 = auVar134._12_4_;
      auVar6._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar6._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar3 = vpand_avx(auVar3,auVar6);
      local_6a0 = auVar3._0_4_;
      fStack_69c = auVar3._4_4_;
      fStack_698 = auVar3._8_4_;
      fStack_694 = auVar3._12_4_;
      auVar9._4_4_ = fStack_66c * fStack_62c + fStack_69c;
      auVar9._0_4_ = local_670 * local_630 + local_6a0;
      auVar9._8_4_ = fStack_668 * fStack_628 + fStack_698;
      auVar9._12_4_ = fStack_664 * fStack_624 + fStack_694;
      auVar3 = vpor_avx(auVar9,auVar25);
      local_b80 = auVar3._0_4_;
      fStack_b7c = auVar3._4_4_;
      fStack_b78 = auVar3._8_4_;
      fStack_b74 = auVar3._12_4_;
      local_b90 = auVar24._0_4_;
      fStack_b8c = auVar24._4_4_;
      fStack_b88 = auVar24._8_4_;
      fStack_b84 = auVar24._12_4_;
      auVar4._8_8_ = 0x40490fdb40490fdb;
      auVar4._0_8_ = 0x40490fdb40490fdb;
      auVar3 = vpor_avx(auVar22,auVar4);
      auVar3 = vcmpps_avx(auVar3,ZEXT816(0),1);
      auVar25._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar25._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar134 = vpor_avx(auVar23,auVar25);
      auVar134 = vpand_avx(auVar20,auVar134);
      auVar22._8_8_ = 0x40490fdb40490fdb;
      auVar22._0_8_ = 0x40490fdb40490fdb;
      auVar22 = vpand_avx(auVar3,auVar22);
      auVar3 = vpandn_avx(auVar3,ZEXT816(0));
      auVar3 = vpor_avx(auVar22,auVar3);
      auVar3 = vpandn_avx(auVar20,auVar3);
      auVar20 = vpor_avx(auVar134,auVar3);
      auVar3._4_4_ = fStack_b7c + fStack_b8c;
      auVar3._0_4_ = local_b80 + local_b90;
      auVar3._12_4_ = fStack_b74 + fStack_b84;
      auVar3._8_4_ = fStack_b78 + fStack_b88;
      auVar3 = vpand_avx(auVar21,auVar3);
      auVar134 = vpternlogq_avx512vl(auVar21,auVar21,auVar21,0xf);
      auVar20 = vpand_avx(auVar134,auVar20);
      auVar3 = vpor_avx(auVar3,auVar20);
      local_4300 = auVar3._0_8_;
      uStackY_42f8 = auVar3._8_8_;
      *(undefined8 *)*local_3ea0 = local_4300;
      *(undefined8 *)(*local_3ea0 + 8) = uStackY_42f8;
      local_3e98 = local_3e98 + 1;
      local_3ea0 = (undefined1 (*) [64])(*local_3ea0 + 0x10);
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}